

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx::SubGridIntersectorKPluecker<4,_4,_true>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  RayK<4> *pRVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  ushort uVar10;
  ushort uVar11;
  uint uVar12;
  uint uVar13;
  BVH *bvh;
  size_t sVar14;
  Geometry *pGVar15;
  long lVar16;
  long lVar17;
  RTCFilterFunctionN p_Var18;
  long lVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  uint uVar35;
  int iVar36;
  uint uVar37;
  long lVar38;
  undefined4 uVar39;
  uint uVar40;
  long lVar41;
  ulong uVar42;
  long lVar43;
  NodeRef root;
  size_t sVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  long lVar48;
  NodeRef *pNVar49;
  uint uVar50;
  long lVar51;
  undefined8 *puVar52;
  ulong uVar53;
  ulong uVar54;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar55;
  bool bVar56;
  float fVar57;
  float fVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar105;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar102;
  float fVar104;
  float fVar106;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar99;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar100;
  float fVar101;
  float fVar103;
  undefined1 in_ZMM0 [64];
  float fVar107;
  float fVar108;
  float fVar132;
  float fVar134;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar133;
  float fVar135;
  float fVar137;
  float fVar138;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar136;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar139;
  float fVar158;
  float fVar159;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar160;
  float fVar162;
  float fVar163;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar161;
  float fVar164;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar165;
  float fVar187;
  float fVar188;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar189;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar190;
  float fVar208;
  float fVar209;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar210;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar211;
  float fVar224;
  float fVar225;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar226;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar227;
  float fVar238;
  float fVar239;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  float fVar240;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  float fVar248;
  float fVar249;
  float fVar255;
  float fVar256;
  float fVar257;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  float fVar258;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar259;
  float fVar260;
  float fVar266;
  float fVar267;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  float fVar268;
  undefined1 auVar265 [16];
  float fVar269;
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  float fVar279;
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  float fVar278;
  float fVar280;
  undefined1 auVar274 [16];
  float fVar276;
  float fVar277;
  undefined1 auVar275 [64];
  float fVar281;
  float fVar285;
  float fVar286;
  undefined1 auVar282 [16];
  float fVar287;
  undefined1 auVar283 [16];
  undefined1 auVar284 [64];
  float fVar288;
  float fVar290;
  float fVar291;
  float fVar292;
  undefined1 auVar289 [64];
  undefined1 auVar293 [16];
  undefined1 in_ZMM13 [64];
  undefined1 auVar294 [64];
  float fVar295;
  undefined1 auVar297 [12];
  undefined1 auVar296 [64];
  undefined1 local_1c78 [16];
  Precalculations pre;
  undefined1 local_1c38 [16];
  undefined1 local_1c28 [16];
  undefined1 local_1be8 [16];
  vfloat<4> upper_y;
  undefined1 local_1bb8 [8];
  float fStack_1bb0;
  float fStack_1bac;
  float local_1ba8;
  float fStack_1ba4;
  float fStack_1ba0;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1b98;
  undefined1 local_1b88 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1b68;
  vbool<4> terminated;
  vfloat<4> lower_y;
  vfloat<4> upper_z;
  vfloat<4> lower_z;
  float local_1ac8;
  float fStack_1ac4;
  float fStack_1ac0;
  float local_1a98;
  float fStack_1a94;
  float fStack_1a90;
  float local_1a88;
  float fStack_1a84;
  float fStack_1a80;
  TravRayK<4,_true> tray;
  vfloat<4> upper_x;
  undefined8 local_1888;
  undefined8 uStack_1880;
  undefined8 local_1878;
  undefined8 uStack_1870;
  vfloat<4> lower_x;
  undefined8 uStack_17a0;
  undefined8 local_1798;
  undefined8 uStack_1790;
  undefined8 local_1788;
  undefined8 uStack_1780;
  undefined8 local_1778;
  undefined8 uStack_1770;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined8 local_1748;
  undefined8 uStack_1740;
  undefined8 local_1738;
  undefined8 uStack_1730;
  undefined8 local_1728;
  undefined8 uStack_1720;
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined8 local_1708;
  undefined8 uStack_1700;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar67 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar166 = vpcmpeqd_avx(auVar67,(undefined1  [16])valid_i->field_0);
    auVar66 = ZEXT816(0) << 0x40;
    auVar21 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar66,5);
    auVar191 = auVar166 & auVar21;
    if ((((auVar191 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar191 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar191 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar191[0xf] < '\0'
       ) {
      auVar21 = vandps_avx(auVar21,auVar166);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar250._8_4_ = 0x7fffffff;
      auVar250._0_8_ = 0x7fffffff7fffffff;
      auVar250._12_4_ = 0x7fffffff;
      auVar166 = vandps_avx(auVar250,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar261._8_4_ = 0x219392ef;
      auVar261._0_8_ = 0x219392ef219392ef;
      auVar261._12_4_ = 0x219392ef;
      auVar191 = vcmpps_avx(auVar166,auVar261,1);
      auVar282._8_4_ = 0x3f800000;
      auVar282._0_8_ = &DAT_3f8000003f800000;
      auVar282._12_4_ = 0x3f800000;
      auVar87 = vdivps_avx(auVar282,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar166 = vandps_avx(auVar250,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar86 = vcmpps_avx(auVar166,auVar261,1);
      auVar228 = vdivps_avx(auVar282,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar166 = vandps_avx(auVar250,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar166 = vcmpps_avx(auVar166,auVar261,1);
      auVar262._8_4_ = 0x5d5e0b6b;
      auVar262._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar262._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar87,auVar262,auVar191)
      ;
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar228,auVar262,auVar86)
      ;
      auVar191 = vdivps_avx(auVar282,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.z.field_0 =
           (vfloat_impl<4>)vblendvps_avx(auVar191,auVar262,auVar166);
      auVar166 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar66,1);
      auVar87._8_4_ = 0x10;
      auVar87._0_8_ = 0x1000000010;
      auVar87._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar166,auVar87);
      auVar166 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar66,5);
      auVar191._8_4_ = 0x20;
      auVar191._0_8_ = 0x2000000020;
      auVar191._12_4_ = 0x20;
      auVar228._8_4_ = 0x30;
      auVar228._0_8_ = 0x3000000030;
      auVar228._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar228,auVar191,auVar166);
      auVar166 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar66,5);
      auVar86._8_4_ = 0x40;
      auVar86._0_8_ = 0x4000000040;
      auVar86._12_4_ = 0x40;
      auVar98._8_4_ = 0x50;
      auVar98._0_8_ = 0x5000000050;
      auVar98._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar98,auVar86,auVar166)
      ;
      auVar166 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar66);
      auVar191 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar66);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar284 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar166,auVar21);
      auVar166._8_4_ = 0xff800000;
      auVar166._0_8_ = 0xff800000ff800000;
      auVar166._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar166,auVar191,auVar21);
      terminated.field_0._0_4_ = auVar21._0_4_ ^ auVar67._0_4_;
      terminated.field_0._4_4_ = auVar21._4_4_ ^ auVar67._4_4_;
      terminated.field_0._8_4_ = auVar21._8_4_ ^ auVar67._8_4_;
      terminated.field_0._12_4_ = auVar21._12_4_ ^ auVar67._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar50 = 3;
      }
      else {
        uVar50 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar2 = ray + 0x80;
      pNVar49 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar55 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar275 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      auVar289 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      auVar67 = vpcmpeqd_avx(in_ZMM13._0_16_,in_ZMM13._0_16_);
      auVar294 = ZEXT1664(auVar67);
      do {
        paVar55 = paVar55 + -1;
        root.ptr = pNVar49[-1].ptr;
        pNVar49 = pNVar49 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_0033c096:
          iVar36 = 3;
        }
        else {
          aVar99 = *paVar55;
          auVar67 = vcmpps_avx((undefined1  [16])aVar99,(undefined1  [16])tray.tfar.field_0,1);
          uVar35 = vmovmskps_avx(auVar67);
          if (uVar35 == 0) {
LAB_0033c0a7:
            iVar36 = 2;
          }
          else {
            uVar54 = (ulong)(uVar35 & 0xff);
            uVar35 = POPCOUNT(uVar35 & 0xff);
            iVar36 = 0;
            if (uVar35 <= uVar50) {
              do {
                sVar44 = 0;
                if (uVar54 != 0) {
                  for (; (uVar54 >> sVar44 & 1) == 0; sVar44 = sVar44 + 1) {
                  }
                }
                auVar294 = ZEXT1664(auVar294._0_16_);
                bVar56 = occluded1(This,bvh,root,sVar44,&pre,ray,&tray,context);
                if (bVar56) {
                  terminated.field_0.i[sVar44] = -1;
                }
                uVar54 = uVar54 & uVar54 - 1;
              } while (uVar54 != 0);
              auVar67 = vpcmpeqd_avx(auVar294._0_16_,auVar294._0_16_);
              auVar294 = ZEXT1664(auVar67);
              auVar67 = auVar67 & ~(undefined1  [16])terminated.field_0;
              iVar36 = 3;
              auVar284 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar275 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
              auVar289 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
              if ((((auVar67 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar67 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar67 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar67[0xf] < '\0') {
                auVar67._8_4_ = 0xff800000;
                auVar67._0_8_ = 0xff800000ff800000;
                auVar67._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar67,
                                   (undefined1  [16])terminated.field_0);
                iVar36 = 2;
              }
            }
            auVar296 = ZEXT1664((undefined1  [16])aVar99);
            if (uVar50 < uVar35) {
              do {
                if ((root.ptr & 8) != 0) {
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_0033c096;
                  auVar67 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar296._0_16_,6);
                  if ((((auVar67 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar67 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar67 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar67[0xf] < '\0') {
                    uVar54 = (ulong)((uint)root.ptr & 0xf);
                    aVar100 = terminated.field_0;
                    if (uVar54 != 8) {
                      uVar45 = root.ptr & 0xfffffffffffffff0;
                      auVar296 = ZEXT1664(auVar294._0_16_ ^ (undefined1  [16])terminated.field_0);
                      lVar38 = 0;
                      do {
                        lVar41 = lVar38 * 0x58;
                        auVar66._8_8_ = 0;
                        auVar66._0_8_ = *(ulong *)(uVar45 + 0x20 + lVar41);
                        auVar111._8_8_ = 0;
                        auVar111._0_8_ = *(ulong *)(uVar45 + 0x24 + lVar41);
                        auVar67 = vpminub_avx(auVar66,auVar111);
                        auVar67 = vpcmpeqb_avx(auVar66,auVar67);
                        auVar67 = vpmovzxbd_avx(auVar294._0_16_ ^ auVar67);
                        auVar67 = vpslld_avx(auVar294._0_16_ ^ auVar67,0x1f);
                        iVar36 = vmovmskps_avx(auVar67);
                        if (iVar36 != 0) {
                          lVar41 = lVar41 + uVar45;
                          uVar46 = (ulong)(byte)iVar36;
                          do {
                            lVar19 = 0;
                            if (uVar46 != 0) {
                              for (; (uVar46 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
                              }
                            }
                            auVar68._8_8_ = 0;
                            auVar68._0_8_ = *(ulong *)(lVar41 + 0x20);
                            auVar67 = vpmovzxbd_avx(auVar68);
                            auVar67 = vcvtdq2ps_avx(auVar67);
                            fVar249 = *(float *)(lVar41 + 0x44);
                            fVar227 = *(float *)(lVar41 + 0x38);
                            lower_x.field_0.v[1] = fVar227 + fVar249 * auVar67._4_4_;
                            lower_x.field_0.v[0] = fVar227 + fVar249 * auVar67._0_4_;
                            lower_x.field_0.v[3] = fVar227 + fVar249 * auVar67._12_4_;
                            lower_x.field_0.v[2] = fVar227 + fVar249 * auVar67._8_4_;
                            auVar69._8_8_ = 0;
                            auVar69._0_8_ = *(ulong *)(lVar41 + 0x24);
                            auVar67 = vpmovzxbd_avx(auVar69);
                            auVar67 = vcvtdq2ps_avx(auVar67);
                            upper_x.field_0.v[1] = fVar227 + fVar249 * auVar67._4_4_;
                            upper_x.field_0.v[0] = fVar227 + fVar249 * auVar67._0_4_;
                            upper_x.field_0.v[2] = fVar227 + fVar249 * auVar67._8_4_;
                            upper_x.field_0.v[3] = fVar227 + fVar249 * auVar67._12_4_;
                            auVar70._8_8_ = 0;
                            auVar70._0_8_ = *(ulong *)(lVar41 + 0x28);
                            auVar67 = vpmovzxbd_avx(auVar70);
                            auVar67 = vcvtdq2ps_avx(auVar67);
                            fVar249 = *(float *)(lVar41 + 0x48);
                            fVar227 = *(float *)(lVar41 + 0x3c);
                            lower_y.field_0.v[1] = fVar227 + fVar249 * auVar67._4_4_;
                            lower_y.field_0.v[0] = fVar227 + fVar249 * auVar67._0_4_;
                            lower_y.field_0.v[3] = fVar227 + fVar249 * auVar67._12_4_;
                            lower_y.field_0.v[2] = fVar227 + fVar249 * auVar67._8_4_;
                            auVar71._8_8_ = 0;
                            auVar71._0_8_ = *(ulong *)(lVar41 + 0x2c);
                            auVar67 = vpmovzxbd_avx(auVar71);
                            auVar67 = vcvtdq2ps_avx(auVar67);
                            upper_y.field_0.v[1] = fVar227 + fVar249 * auVar67._4_4_;
                            upper_y.field_0.v[0] = fVar227 + fVar249 * auVar67._0_4_;
                            upper_y.field_0.v[2] = fVar227 + fVar249 * auVar67._8_4_;
                            upper_y.field_0.v[3] = fVar227 + fVar249 * auVar67._12_4_;
                            auVar72._8_8_ = 0;
                            auVar72._0_8_ = *(ulong *)(lVar41 + 0x30);
                            auVar67 = vpmovzxbd_avx(auVar72);
                            auVar67 = vcvtdq2ps_avx(auVar67);
                            fVar249 = *(float *)(lVar41 + 0x4c);
                            fVar227 = *(float *)(lVar41 + 0x40);
                            lower_z.field_0.v[1] = fVar227 + fVar249 * auVar67._4_4_;
                            lower_z.field_0.v[0] = fVar227 + fVar249 * auVar67._0_4_;
                            lower_z.field_0.v[3] = fVar227 + fVar249 * auVar67._12_4_;
                            lower_z.field_0.v[2] = fVar227 + fVar249 * auVar67._8_4_;
                            auVar73._8_8_ = 0;
                            auVar73._0_8_ = *(ulong *)(lVar41 + 0x34);
                            auVar67 = vpmovzxbd_avx(auVar73);
                            auVar67 = vcvtdq2ps_avx(auVar67);
                            upper_z.field_0.v[1] = fVar227 + fVar249 * auVar67._4_4_;
                            upper_z.field_0.v[0] = fVar227 + fVar249 * auVar67._0_4_;
                            upper_z.field_0.v[3] = fVar227 + fVar249 * auVar67._12_4_;
                            upper_z.field_0.v[2] = fVar227 + fVar249 * auVar67._8_4_;
                            iVar36 = lower_x.field_0.i[lVar19];
                            auVar74._4_4_ = iVar36;
                            auVar74._0_4_ = iVar36;
                            auVar74._8_4_ = iVar36;
                            auVar74._12_4_ = iVar36;
                            auVar22._8_8_ = tray.org.field_0._8_8_;
                            auVar22._0_8_ = tray.org.field_0._0_8_;
                            auVar23._8_8_ = tray.org.field_0._24_8_;
                            auVar23._0_8_ = tray.org.field_0._16_8_;
                            auVar28._8_8_ = tray.org.field_0._40_8_;
                            auVar28._0_8_ = tray.org.field_0._32_8_;
                            auVar67 = vsubps_avx(auVar74,auVar22);
                            auVar75._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar67._0_4_;
                            auVar75._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar67._4_4_;
                            auVar75._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar67._8_4_;
                            auVar75._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar67._12_4_;
                            iVar36 = lower_y.field_0.i[lVar19];
                            auVar213._4_4_ = iVar36;
                            auVar213._0_4_ = iVar36;
                            auVar213._8_4_ = iVar36;
                            auVar213._12_4_ = iVar36;
                            auVar67 = vsubps_avx(auVar213,auVar23);
                            auVar214._0_4_ = (float)tray.rdir.field_0._16_4_ * auVar67._0_4_;
                            auVar214._4_4_ = (float)tray.rdir.field_0._20_4_ * auVar67._4_4_;
                            auVar214._8_4_ = (float)tray.rdir.field_0._24_4_ * auVar67._8_4_;
                            auVar214._12_4_ = (float)tray.rdir.field_0._28_4_ * auVar67._12_4_;
                            iVar36 = lower_z.field_0.i[lVar19];
                            auVar242._4_4_ = iVar36;
                            auVar242._0_4_ = iVar36;
                            auVar242._8_4_ = iVar36;
                            auVar242._12_4_ = iVar36;
                            auVar67 = vsubps_avx(auVar242,auVar28);
                            auVar243._0_4_ = tray.rdir.field_0._32_4_ * auVar67._0_4_;
                            auVar243._4_4_ = tray.rdir.field_0._36_4_ * auVar67._4_4_;
                            auVar243._8_4_ = tray.rdir.field_0._40_4_ * auVar67._8_4_;
                            auVar243._12_4_ = tray.rdir.field_0._44_4_ * auVar67._12_4_;
                            iVar36 = upper_x.field_0.i[lVar19];
                            auVar264._4_4_ = iVar36;
                            auVar264._0_4_ = iVar36;
                            auVar264._8_4_ = iVar36;
                            auVar264._12_4_ = iVar36;
                            auVar67 = vsubps_avx(auVar264,auVar22);
                            auVar112._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar67._0_4_;
                            auVar112._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar67._4_4_;
                            auVar112._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar67._8_4_;
                            auVar112._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar67._12_4_;
                            uVar39 = *(undefined4 *)(local_1bb8 + lVar19 * 4 + -0x10);
                            auVar192._4_4_ = uVar39;
                            auVar192._0_4_ = uVar39;
                            auVar192._8_4_ = uVar39;
                            auVar192._12_4_ = uVar39;
                            auVar67 = vsubps_avx(auVar192,auVar23);
                            auVar141._0_4_ = (float)tray.rdir.field_0._16_4_ * auVar67._0_4_;
                            auVar141._4_4_ = (float)tray.rdir.field_0._20_4_ * auVar67._4_4_;
                            auVar141._8_4_ = (float)tray.rdir.field_0._24_4_ * auVar67._8_4_;
                            auVar141._12_4_ = (float)tray.rdir.field_0._28_4_ * auVar67._12_4_;
                            iVar36 = upper_z.field_0.i[lVar19];
                            auVar193._4_4_ = iVar36;
                            auVar193._0_4_ = iVar36;
                            auVar193._8_4_ = iVar36;
                            auVar193._12_4_ = iVar36;
                            auVar67 = vsubps_avx(auVar193,auVar28);
                            auVar168._0_4_ = tray.rdir.field_0._32_4_ * auVar67._0_4_;
                            auVar168._4_4_ = tray.rdir.field_0._36_4_ * auVar67._4_4_;
                            auVar168._8_4_ = tray.rdir.field_0._40_4_ * auVar67._8_4_;
                            auVar168._12_4_ = tray.rdir.field_0._44_4_ * auVar67._12_4_;
                            auVar67 = vminps_avx(auVar75,auVar112);
                            auVar166 = vminps_avx(auVar214,auVar141);
                            auVar67 = vmaxps_avx(auVar67,auVar166);
                            auVar166 = vminps_avx(auVar243,auVar168);
                            auVar67 = vmaxps_avx(auVar67,auVar166);
                            auVar194._0_4_ = auVar275._0_4_ * auVar67._0_4_;
                            auVar194._4_4_ = auVar275._4_4_ * auVar67._4_4_;
                            auVar194._8_4_ = auVar275._8_4_ * auVar67._8_4_;
                            auVar194._12_4_ = auVar275._12_4_ * auVar67._12_4_;
                            auVar67 = vmaxps_avx(auVar75,auVar112);
                            auVar166 = vmaxps_avx(auVar214,auVar141);
                            auVar166 = vminps_avx(auVar67,auVar166);
                            auVar67 = vmaxps_avx(auVar243,auVar168);
                            auVar67 = vminps_avx(auVar166,auVar67);
                            auVar76._0_4_ = auVar289._0_4_ * auVar67._0_4_;
                            auVar76._4_4_ = auVar289._4_4_ * auVar67._4_4_;
                            auVar76._8_4_ = auVar289._8_4_ * auVar67._8_4_;
                            auVar76._12_4_ = auVar289._12_4_ * auVar67._12_4_;
                            auVar67 = vmaxps_avx(auVar194,(undefined1  [16])tray.tnear.field_0);
                            auVar166 = vminps_avx(auVar76,(undefined1  [16])tray.tfar.field_0);
                            auVar67 = vcmpps_avx(auVar67,auVar166,2);
                            auVar166 = auVar296._0_16_;
                            auVar67 = auVar166 & auVar67;
                            if ((((auVar67 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                 && (auVar67 >> 0x3f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                (auVar67 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                                && -1 < auVar67[0xf]) {
                              bVar56 = false;
                            }
                            else {
                              uVar10 = *(ushort *)(lVar41 + lVar19 * 8);
                              uVar11 = *(ushort *)(lVar41 + 2 + lVar19 * 8);
                              uVar35 = *(uint *)(lVar41 + 0x50);
                              uVar12 = *(uint *)(lVar41 + 4 + lVar19 * 8);
                              pGVar15 = (context->scene->geometries).items[uVar35].ptr;
                              lVar16 = *(long *)&pGVar15->field_0x58;
                              lVar17 = *(long *)&pGVar15[1].time_range.upper;
                              lVar51 = (ulong)uVar12 *
                                       pGVar15[1].super_RefCount.refCounter.
                                       super___atomic_base<unsigned_long>._M_i;
                              uVar37 = uVar10 & 0x7fff;
                              uVar40 = uVar11 & 0x7fff;
                              uVar13 = *(uint *)(lVar16 + 4 + lVar51);
                              uVar47 = (ulong)uVar13;
                              uVar53 = (ulong)(uVar13 * uVar40 + *(int *)(lVar16 + lVar51) + uVar37)
                              ;
                              p_Var18 = pGVar15[1].intersectionFilterN;
                              puVar52 = (undefined8 *)(lVar17 + (long)p_Var18 * uVar53);
                              puVar3 = (undefined8 *)(lVar17 + (uVar53 + 1) * (long)p_Var18);
                              lVar19 = uVar53 + uVar47;
                              lVar48 = uVar53 + uVar47 + 1;
                              puVar4 = (undefined8 *)(lVar17 + lVar19 * (long)p_Var18);
                              uStack_17a0 = puVar4[1];
                              puVar5 = (undefined8 *)(lVar17 + lVar48 * (long)p_Var18);
                              local_1768 = *puVar5;
                              uStack_1760 = puVar5[1];
                              uVar42 = (ulong)(-1 < (short)uVar10);
                              puVar5 = (undefined8 *)
                                       (lVar17 + (uVar53 + uVar42 + 1) * (long)p_Var18);
                              lVar43 = uVar42 + lVar48;
                              puVar6 = (undefined8 *)(lVar17 + lVar43 * (long)p_Var18);
                              local_1778 = *puVar6;
                              uStack_1770 = puVar6[1];
                              if ((short)uVar11 < 0) {
                                uVar47 = 0;
                              }
                              puVar6 = (undefined8 *)(lVar17 + (lVar19 + uVar47) * (long)p_Var18);
                              puVar7 = (undefined8 *)(lVar17 + (lVar48 + uVar47) * (long)p_Var18);
                              local_1738 = *puVar7;
                              uStack_1730 = puVar7[1];
                              puVar7 = (undefined8 *)(lVar17 + (uVar47 + lVar43) * (long)p_Var18);
                              lower_x.field_0._0_8_ = *puVar52;
                              lower_x.field_0._8_8_ = puVar52[1];
                              local_1798 = *puVar3;
                              uStack_1790 = puVar3[1];
                              local_1788 = *puVar5;
                              uStack_1780 = puVar5[1];
                              local_1758 = *puVar4;
                              uStack_1750 = uStack_17a0;
                              local_1748 = local_1768;
                              uStack_1740 = uStack_1760;
                              local_1728 = *puVar6;
                              uStack_1720 = puVar6[1];
                              local_1718 = local_1768;
                              uStack_1710 = uStack_1760;
                              local_1708 = local_1778;
                              uStack_1700 = uStack_1770;
                              local_16f8 = *puVar7;
                              uStack_16f0 = puVar7[1];
                              local_16e8 = local_1738;
                              uStack_16e0 = uStack_1730;
                              auVar67 = vshufps_avx(ZEXT416(uVar35),ZEXT416(uVar35),0);
                              auVar191 = vshufps_avx(ZEXT416(uVar12),ZEXT416(uVar12),0);
                              puVar52 = &uStack_17a0;
                              uVar42 = 0;
                              local_1c78 = auVar166;
                              do {
                                uVar39 = *(undefined4 *)(puVar52 + -7);
                                auVar293._4_4_ = uVar39;
                                auVar293._0_4_ = uVar39;
                                auVar293._8_4_ = uVar39;
                                auVar293._12_4_ = uVar39;
                                uVar39 = *(undefined4 *)((long)puVar52 + -0x34);
                                auVar142._4_4_ = uVar39;
                                auVar142._0_4_ = uVar39;
                                auVar142._8_4_ = uVar39;
                                auVar142._12_4_ = uVar39;
                                uVar39 = *(undefined4 *)(puVar52 + -6);
                                auVar113._4_4_ = uVar39;
                                auVar113._0_4_ = uVar39;
                                auVar113._8_4_ = uVar39;
                                auVar113._12_4_ = uVar39;
                                uVar39 = *(undefined4 *)(puVar52 + -1);
                                auVar77._4_4_ = uVar39;
                                auVar77._0_4_ = uVar39;
                                auVar77._8_4_ = uVar39;
                                auVar77._12_4_ = uVar39;
                                uVar39 = *(undefined4 *)((long)puVar52 + -4);
                                auVar215._4_4_ = uVar39;
                                auVar215._0_4_ = uVar39;
                                auVar215._8_4_ = uVar39;
                                auVar215._12_4_ = uVar39;
                                uVar39 = *(undefined4 *)puVar52;
                                auVar229._4_4_ = uVar39;
                                auVar229._0_4_ = uVar39;
                                auVar229._8_4_ = uVar39;
                                auVar229._12_4_ = uVar39;
                                local_1878 = auVar67._0_8_;
                                uStack_1870 = auVar67._8_8_;
                                lower_z.field_0._0_8_ = local_1878;
                                lower_z.field_0._8_8_ = uStack_1870;
                                local_1888 = auVar191._0_8_;
                                uStack_1880 = auVar191._8_8_;
                                upper_z.field_0._0_8_ = local_1888;
                                upper_z.field_0._8_8_ = uStack_1880;
                                auVar66 = *(undefined1 (*) [16])(ray + 0x10);
                                auVar86 = *(undefined1 (*) [16])(ray + 0x20);
                                auVar228 = vsubps_avx(auVar142,auVar66);
                                auVar98 = vsubps_avx(auVar113,auVar86);
                                auVar250 = vsubps_avx(auVar215,auVar66);
                                auVar261 = vsubps_avx(auVar229,auVar86);
                                auVar87 = vsubps_avx(auVar250,auVar228);
                                auVar262 = vsubps_avx(auVar261,auVar98);
                                fVar249 = auVar228._0_4_;
                                fVar211 = auVar250._0_4_ + fVar249;
                                fVar257 = auVar228._4_4_;
                                fVar224 = auVar250._4_4_ + fVar257;
                                fVar136 = auVar228._8_4_;
                                fVar225 = auVar250._8_4_ + fVar136;
                                fVar20 = auVar228._12_4_;
                                fVar226 = auVar250._12_4_ + fVar20;
                                fVar259 = auVar98._0_4_;
                                fVar227 = fVar259 + auVar261._0_4_;
                                fVar266 = auVar98._4_4_;
                                fVar238 = fVar266 + auVar261._4_4_;
                                fVar267 = auVar98._8_4_;
                                fVar239 = fVar267 + auVar261._8_4_;
                                fVar268 = auVar98._12_4_;
                                fVar240 = fVar268 + auVar261._12_4_;
                                fVar58 = auVar262._0_4_;
                                auVar244._0_4_ = fVar211 * fVar58;
                                fVar102 = auVar262._4_4_;
                                auVar244._4_4_ = fVar224 * fVar102;
                                fVar104 = auVar262._8_4_;
                                auVar244._8_4_ = fVar225 * fVar104;
                                fVar106 = auVar262._12_4_;
                                auVar244._12_4_ = fVar226 * fVar106;
                                fVar107 = auVar87._0_4_;
                                auVar251._0_4_ = fVar107 * fVar227;
                                fVar132 = auVar87._4_4_;
                                auVar251._4_4_ = fVar132 * fVar238;
                                fVar134 = auVar87._8_4_;
                                auVar251._8_4_ = fVar134 * fVar239;
                                fVar137 = auVar87._12_4_;
                                auVar251._12_4_ = fVar137 * fVar240;
                                auVar262 = vsubps_avx(auVar251,auVar244);
                                auVar87 = *(undefined1 (*) [16])ray;
                                auVar282 = vsubps_avx(auVar293,auVar87);
                                auVar111 = vsubps_avx(auVar77,auVar87);
                                auVar22 = vsubps_avx(auVar111,auVar282);
                                fVar57 = auVar22._0_4_;
                                auVar230._0_4_ = fVar57 * fVar227;
                                fVar101 = auVar22._4_4_;
                                auVar230._4_4_ = fVar101 * fVar238;
                                fVar103 = auVar22._8_4_;
                                auVar230._8_4_ = fVar103 * fVar239;
                                fVar105 = auVar22._12_4_;
                                auVar230._12_4_ = fVar105 * fVar240;
                                fVar227 = auVar282._0_4_;
                                fVar248 = auVar111._0_4_ + fVar227;
                                fVar238 = auVar282._4_4_;
                                fVar255 = auVar111._4_4_ + fVar238;
                                fVar239 = auVar282._8_4_;
                                fVar256 = auVar111._8_4_ + fVar239;
                                fVar240 = auVar282._12_4_;
                                fVar258 = auVar111._12_4_ + fVar240;
                                auVar169._0_4_ = fVar248 * fVar58;
                                auVar169._4_4_ = fVar255 * fVar102;
                                auVar169._8_4_ = fVar256 * fVar104;
                                auVar169._12_4_ = fVar258 * fVar106;
                                auVar22 = vsubps_avx(auVar169,auVar230);
                                auVar231._0_4_ = fVar248 * fVar107;
                                auVar231._4_4_ = fVar255 * fVar132;
                                auVar231._8_4_ = fVar256 * fVar134;
                                auVar231._12_4_ = fVar258 * fVar137;
                                auVar216._0_4_ = fVar57 * fVar211;
                                auVar216._4_4_ = fVar101 * fVar224;
                                auVar216._8_4_ = fVar103 * fVar225;
                                auVar216._12_4_ = fVar105 * fVar226;
                                auVar23 = vsubps_avx(auVar216,auVar231);
                                fVar211 = *(float *)(ray + 0x60);
                                fVar224 = *(float *)(ray + 100);
                                fVar225 = *(float *)(ray + 0x68);
                                auVar33 = *(undefined1 (*) [12])(ray + 0x60);
                                fVar226 = *(float *)(ray + 0x6c);
                                fVar248 = *(float *)(ray + 0x50);
                                fVar255 = *(float *)(ray + 0x54);
                                fVar256 = *(float *)(ray + 0x58);
                                auVar34 = *(undefined1 (*) [12])(ray + 0x50);
                                fVar258 = *(float *)(ray + 0x5c);
                                pRVar1 = ray + 0x40;
                                auVar32 = *(undefined1 (*) [12])pRVar1;
                                fVar24 = *(float *)(ray + 0x4c);
                                auVar297 = SUB1612(*(undefined1 (*) [16])pRVar1,4);
                                auVar252._0_4_ =
                                     auVar262._0_4_ * *(float *)pRVar1 +
                                     fVar211 * auVar23._0_4_ + fVar248 * auVar22._0_4_;
                                auVar252._4_4_ =
                                     auVar262._4_4_ * *(float *)(ray + 0x44) +
                                     fVar224 * auVar23._4_4_ + fVar255 * auVar22._4_4_;
                                auVar252._8_4_ =
                                     auVar262._8_4_ * *(float *)(ray + 0x48) +
                                     fVar225 * auVar23._8_4_ + fVar256 * auVar22._8_4_;
                                auVar252._12_4_ =
                                     auVar262._12_4_ * fVar24 +
                                     fVar226 * auVar23._12_4_ + fVar258 * auVar22._12_4_;
                                uVar39 = *(undefined4 *)((long)puVar52 + -0x24);
                                auVar78._4_4_ = uVar39;
                                auVar78._0_4_ = uVar39;
                                auVar78._8_4_ = uVar39;
                                auVar78._12_4_ = uVar39;
                                auVar66 = vsubps_avx(auVar78,auVar66);
                                uVar39 = *(undefined4 *)(puVar52 + -4);
                                auVar79._4_4_ = uVar39;
                                auVar79._0_4_ = uVar39;
                                auVar79._8_4_ = uVar39;
                                auVar79._12_4_ = uVar39;
                                auVar86 = vsubps_avx(auVar79,auVar86);
                                auVar228 = vsubps_avx(auVar228,auVar66);
                                auVar98 = vsubps_avx(auVar98,auVar86);
                                fVar108 = fVar249 + auVar66._0_4_;
                                fVar133 = fVar257 + auVar66._4_4_;
                                fVar135 = fVar136 + auVar66._8_4_;
                                fVar138 = fVar20 + auVar66._12_4_;
                                fVar190 = fVar259 + auVar86._0_4_;
                                fVar208 = fVar266 + auVar86._4_4_;
                                fVar209 = fVar267 + auVar86._8_4_;
                                fVar210 = fVar268 + auVar86._12_4_;
                                fVar279 = auVar98._0_4_;
                                auVar270._0_4_ = fVar279 * fVar108;
                                fVar280 = auVar98._4_4_;
                                auVar270._4_4_ = fVar280 * fVar133;
                                fVar281 = auVar98._8_4_;
                                auVar270._8_4_ = fVar281 * fVar135;
                                fVar285 = auVar98._12_4_;
                                auVar270._12_4_ = fVar285 * fVar138;
                                fVar139 = auVar228._0_4_;
                                auVar217._0_4_ = fVar139 * fVar190;
                                fVar161 = auVar228._4_4_;
                                auVar217._4_4_ = fVar161 * fVar208;
                                fVar159 = auVar228._8_4_;
                                auVar217._8_4_ = fVar159 * fVar209;
                                fVar162 = auVar228._12_4_;
                                auVar217._12_4_ = fVar162 * fVar210;
                                auVar228 = vsubps_avx(auVar217,auVar270);
                                uVar39 = *(undefined4 *)(puVar52 + -5);
                                auVar232._4_4_ = uVar39;
                                auVar232._0_4_ = uVar39;
                                auVar232._8_4_ = uVar39;
                                auVar232._12_4_ = uVar39;
                                auVar87 = vsubps_avx(auVar232,auVar87);
                                auVar98 = vsubps_avx(auVar282,auVar87);
                                fVar269 = auVar98._0_4_;
                                auVar195._0_4_ = fVar269 * fVar190;
                                fVar276 = auVar98._4_4_;
                                auVar195._4_4_ = fVar276 * fVar208;
                                fVar277 = auVar98._8_4_;
                                auVar195._8_4_ = fVar277 * fVar209;
                                fVar278 = auVar98._12_4_;
                                auVar195._12_4_ = fVar278 * fVar210;
                                fVar190 = fVar227 + auVar87._0_4_;
                                fVar208 = fVar238 + auVar87._4_4_;
                                fVar209 = fVar239 + auVar87._8_4_;
                                fVar210 = fVar240 + auVar87._12_4_;
                                auVar233._0_4_ = fVar190 * fVar279;
                                auVar233._4_4_ = fVar208 * fVar280;
                                auVar233._8_4_ = fVar209 * fVar281;
                                auVar233._12_4_ = fVar210 * fVar285;
                                auVar98 = vsubps_avx(auVar233,auVar195);
                                auVar234._0_4_ = fVar190 * fVar139;
                                auVar234._4_4_ = fVar208 * fVar161;
                                auVar234._8_4_ = fVar209 * fVar159;
                                auVar234._12_4_ = fVar210 * fVar162;
                                auVar114._0_4_ = fVar269 * fVar108;
                                auVar114._4_4_ = fVar276 * fVar133;
                                auVar114._8_4_ = fVar277 * fVar135;
                                auVar114._12_4_ = fVar278 * fVar138;
                                auVar262 = vsubps_avx(auVar114,auVar234);
                                fVar291 = auVar32._0_4_;
                                fVar292 = auVar32._4_4_;
                                fVar295 = auVar32._8_4_;
                                auVar253._0_4_ =
                                     fVar291 * auVar228._0_4_ +
                                     fVar211 * auVar262._0_4_ + fVar248 * auVar98._0_4_;
                                auVar253._4_4_ =
                                     fVar292 * auVar228._4_4_ +
                                     fVar224 * auVar262._4_4_ + fVar255 * auVar98._4_4_;
                                auVar253._8_4_ =
                                     fVar295 * auVar228._8_4_ +
                                     fVar225 * auVar262._8_4_ + fVar256 * auVar98._8_4_;
                                auVar253._12_4_ =
                                     fVar24 * auVar228._12_4_ +
                                     fVar226 * auVar262._12_4_ + fVar258 * auVar98._12_4_;
                                auVar228 = vsubps_avx(auVar87,auVar111);
                                fVar190 = auVar111._0_4_ + auVar87._0_4_;
                                fVar208 = auVar111._4_4_ + auVar87._4_4_;
                                fVar209 = auVar111._8_4_ + auVar87._8_4_;
                                fVar210 = auVar111._12_4_ + auVar87._12_4_;
                                auVar87 = vsubps_avx(auVar66,auVar250);
                                fVar165 = auVar66._0_4_ + auVar250._0_4_;
                                fVar187 = auVar66._4_4_ + auVar250._4_4_;
                                fVar188 = auVar66._8_4_ + auVar250._8_4_;
                                fVar189 = auVar66._12_4_ + auVar250._12_4_;
                                auVar98 = vsubps_avx(auVar86,auVar261);
                                fVar108 = auVar86._0_4_ + auVar261._0_4_;
                                fVar133 = auVar86._4_4_ + auVar261._4_4_;
                                fVar135 = auVar86._8_4_ + auVar261._8_4_;
                                fVar138 = auVar86._12_4_ + auVar261._12_4_;
                                fVar286 = auVar98._0_4_;
                                auVar196._0_4_ = fVar286 * fVar165;
                                fVar287 = auVar98._4_4_;
                                auVar196._4_4_ = fVar287 * fVar187;
                                fVar288 = auVar98._8_4_;
                                auVar196._8_4_ = fVar288 * fVar188;
                                fVar290 = auVar98._12_4_;
                                auVar196._12_4_ = fVar290 * fVar189;
                                fVar158 = auVar87._0_4_;
                                auVar218._0_4_ = fVar158 * fVar108;
                                fVar164 = auVar87._4_4_;
                                auVar218._4_4_ = fVar164 * fVar133;
                                fVar160 = auVar87._8_4_;
                                auVar218._8_4_ = fVar160 * fVar135;
                                fVar163 = auVar87._12_4_;
                                auVar218._12_4_ = fVar163 * fVar138;
                                auVar66 = vsubps_avx(auVar218,auVar196);
                                fVar260 = auVar228._0_4_;
                                auVar80._0_4_ = fVar260 * fVar108;
                                fVar108 = auVar228._4_4_;
                                auVar80._4_4_ = fVar108 * fVar133;
                                fVar133 = auVar228._8_4_;
                                auVar80._8_4_ = fVar133 * fVar135;
                                fVar135 = auVar228._12_4_;
                                auVar80._12_4_ = fVar135 * fVar138;
                                auVar219._0_4_ = fVar286 * fVar190;
                                auVar219._4_4_ = fVar287 * fVar208;
                                auVar219._8_4_ = fVar288 * fVar209;
                                auVar219._12_4_ = fVar290 * fVar210;
                                auVar86 = vsubps_avx(auVar219,auVar80);
                                auVar115._0_4_ = fVar190 * fVar158;
                                auVar115._4_4_ = fVar208 * fVar164;
                                auVar115._8_4_ = fVar209 * fVar160;
                                auVar115._12_4_ = fVar210 * fVar163;
                                auVar170._0_4_ = fVar260 * fVar165;
                                auVar170._4_4_ = fVar108 * fVar187;
                                auVar170._8_4_ = fVar133 * fVar188;
                                auVar170._12_4_ = fVar135 * fVar189;
                                auVar87 = vsubps_avx(auVar170,auVar115);
                                auVar81._0_4_ =
                                     fVar291 * auVar66._0_4_ +
                                     fVar211 * auVar87._0_4_ + fVar248 * auVar86._0_4_;
                                auVar81._4_4_ =
                                     fVar292 * auVar66._4_4_ +
                                     fVar224 * auVar87._4_4_ + fVar255 * auVar86._4_4_;
                                auVar81._8_4_ =
                                     fVar295 * auVar66._8_4_ +
                                     fVar225 * auVar87._8_4_ + fVar256 * auVar86._8_4_;
                                auVar81._12_4_ =
                                     fVar24 * auVar66._12_4_ +
                                     fVar226 * auVar87._12_4_ + fVar258 * auVar86._12_4_;
                                local_1be8._0_4_ = auVar81._0_4_ + auVar253._0_4_ + auVar252._0_4_;
                                local_1be8._4_4_ = auVar81._4_4_ + auVar253._4_4_ + auVar252._4_4_;
                                local_1be8._8_4_ = auVar81._8_4_ + auVar253._8_4_ + auVar252._8_4_;
                                local_1be8._12_4_ =
                                     auVar81._12_4_ + auVar253._12_4_ + auVar252._12_4_;
                                auVar220._8_4_ = 0x7fffffff;
                                auVar220._0_8_ = 0x7fffffff7fffffff;
                                auVar220._12_4_ = 0x7fffffff;
                                auVar66 = vandps_avx(local_1be8,auVar220);
                                auVar116._0_4_ = auVar66._0_4_ * 1.1920929e-07;
                                auVar116._4_4_ = auVar66._4_4_ * 1.1920929e-07;
                                auVar116._8_4_ = auVar66._8_4_ * 1.1920929e-07;
                                auVar116._12_4_ = auVar66._12_4_ * 1.1920929e-07;
                                auVar66 = vminps_avx(auVar252,auVar253);
                                auVar66 = vminps_avx(auVar66,auVar81);
                                uVar47 = CONCAT44(auVar116._4_4_,auVar116._0_4_);
                                auVar197._0_8_ = uVar47 ^ 0x8000000080000000;
                                auVar197._8_4_ = -auVar116._8_4_;
                                auVar197._12_4_ = -auVar116._12_4_;
                                auVar66 = vcmpps_avx(auVar66,auVar197,5);
                                auVar86 = vmaxps_avx(auVar252,auVar253);
                                auVar86 = vmaxps_avx(auVar86,auVar81);
                                auVar86 = vcmpps_avx(auVar86,auVar116,2);
                                auVar66 = vorps_avx(auVar66,auVar86);
                                auVar86 = local_1c78 & auVar66;
                                auVar66 = vandps_avx(auVar66,local_1c78);
                                uVar39 = *(undefined4 *)(puVar52 + -3);
                                uVar8 = *(undefined4 *)((long)puVar52 + -0x14);
                                uVar9 = *(undefined4 *)(puVar52 + -2);
                                auVar87 = auVar228;
                                if ((((auVar86 >> 0x1f & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar86 >> 0x3f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar86 >> 0x5f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) && -1 < auVar86[0xf]) {
LAB_0033b93a:
                                  auVar297 = auVar87._4_12_;
                                  local_1be8 = local_1b88;
                                  local_1b98 = local_1b68;
                                  auVar86 = vpcmpeqd_avx(auVar98,auVar98);
                                }
                                else {
                                  auVar82._0_4_ = fVar139 * fVar58;
                                  auVar82._4_4_ = fVar161 * fVar102;
                                  auVar82._8_4_ = fVar159 * fVar104;
                                  auVar82._12_4_ = fVar162 * fVar106;
                                  auVar117._0_4_ = fVar279 * fVar107;
                                  auVar117._4_4_ = fVar280 * fVar132;
                                  auVar117._8_4_ = fVar281 * fVar134;
                                  auVar117._12_4_ = fVar285 * fVar137;
                                  auVar98 = vsubps_avx(auVar117,auVar82);
                                  auVar171._0_4_ = fVar279 * fVar158;
                                  auVar171._4_4_ = fVar280 * fVar164;
                                  auVar171._8_4_ = fVar281 * fVar160;
                                  auVar171._12_4_ = fVar285 * fVar163;
                                  auVar198._0_4_ = fVar139 * fVar286;
                                  auVar198._4_4_ = fVar161 * fVar287;
                                  auVar198._8_4_ = fVar159 * fVar288;
                                  auVar198._12_4_ = fVar162 * fVar290;
                                  auVar250 = vsubps_avx(auVar198,auVar171);
                                  auVar86 = vandps_avx(auVar82,auVar220);
                                  auVar87 = vandps_avx(auVar171,auVar220);
                                  auVar86 = vcmpps_avx(auVar86,auVar87,1);
                                  local_1b98 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                               vblendvps_avx(auVar250,auVar98,auVar86);
                                  auVar83._0_4_ = fVar269 * fVar286;
                                  auVar83._4_4_ = fVar276 * fVar287;
                                  auVar83._8_4_ = fVar277 * fVar288;
                                  auVar83._12_4_ = fVar278 * fVar290;
                                  auVar118._0_4_ = fVar269 * fVar58;
                                  auVar118._4_4_ = fVar276 * fVar102;
                                  auVar118._8_4_ = fVar277 * fVar104;
                                  auVar118._12_4_ = fVar278 * fVar106;
                                  auVar172._0_4_ = fVar57 * fVar279;
                                  auVar172._4_4_ = fVar101 * fVar280;
                                  auVar172._8_4_ = fVar103 * fVar281;
                                  auVar172._12_4_ = fVar105 * fVar285;
                                  auVar98 = vsubps_avx(auVar118,auVar172);
                                  auVar199._0_4_ = fVar260 * fVar279;
                                  auVar199._4_4_ = fVar108 * fVar280;
                                  auVar199._8_4_ = fVar133 * fVar281;
                                  auVar199._12_4_ = fVar135 * fVar285;
                                  auVar250 = vsubps_avx(auVar199,auVar83);
                                  auVar86 = vandps_avx(auVar172,auVar220);
                                  auVar87 = vandps_avx(auVar83,auVar220);
                                  auVar86 = vcmpps_avx(auVar86,auVar87,1);
                                  auVar98 = vblendvps_avx(auVar250,auVar98,auVar86);
                                  auVar84._0_4_ = fVar260 * fVar139;
                                  auVar84._4_4_ = fVar108 * fVar161;
                                  auVar84._8_4_ = fVar133 * fVar159;
                                  auVar84._12_4_ = fVar135 * fVar162;
                                  auVar119._0_4_ = fVar57 * fVar139;
                                  auVar119._4_4_ = fVar101 * fVar161;
                                  auVar119._8_4_ = fVar103 * fVar159;
                                  auVar119._12_4_ = fVar105 * fVar162;
                                  auVar173._0_4_ = fVar269 * fVar107;
                                  auVar173._4_4_ = fVar276 * fVar132;
                                  auVar173._8_4_ = fVar277 * fVar134;
                                  auVar173._12_4_ = fVar278 * fVar137;
                                  auVar200._0_4_ = fVar269 * fVar158;
                                  auVar200._4_4_ = fVar276 * fVar164;
                                  auVar200._8_4_ = fVar277 * fVar160;
                                  auVar200._12_4_ = fVar278 * fVar163;
                                  auVar250 = vsubps_avx(auVar119,auVar173);
                                  auVar261 = vsubps_avx(auVar200,auVar84);
                                  auVar86 = vandps_avx(auVar173,auVar220);
                                  auVar87 = vandps_avx(auVar84,auVar220);
                                  auVar86 = vcmpps_avx(auVar86,auVar87,1);
                                  auVar86 = vblendvps_avx(auVar261,auVar250,auVar86);
                                  local_1a88 = auVar33._0_4_;
                                  fStack_1a84 = auVar33._4_4_;
                                  fStack_1a80 = auVar33._8_4_;
                                  local_1a98 = auVar34._0_4_;
                                  fStack_1a94 = auVar34._4_4_;
                                  fStack_1a90 = auVar34._8_4_;
                                  fVar58 = fVar291 * local_1b98.v[0] +
                                           auVar86._0_4_ * local_1a88 + auVar98._0_4_ * local_1a98;
                                  fVar102 = fVar292 * local_1b98.v[1] +
                                            auVar86._4_4_ * fStack_1a84 +
                                            auVar98._4_4_ * fStack_1a94;
                                  fVar104 = fVar295 * local_1b98.v[2] +
                                            auVar86._8_4_ * fStack_1a80 +
                                            auVar98._8_4_ * fStack_1a90;
                                  fVar106 = fVar24 * local_1b98.v[3] +
                                            auVar86._12_4_ * fVar226 + auVar98._12_4_ * fVar258;
                                  auVar85._0_4_ = fVar58 + fVar58;
                                  auVar85._4_4_ = fVar102 + fVar102;
                                  auVar85._8_4_ = fVar104 + fVar104;
                                  auVar85._12_4_ = fVar106 + fVar106;
                                  fVar58 = local_1b98.v[0] * fVar227 +
                                           auVar86._0_4_ * fVar259 + auVar98._0_4_ * fVar249;
                                  fVar102 = local_1b98.v[1] * fVar238 +
                                            auVar86._4_4_ * fVar266 + auVar98._4_4_ * fVar257;
                                  fVar136 = local_1b98.v[2] * fVar239 +
                                            auVar86._8_4_ * fVar267 + auVar98._8_4_ * fVar136;
                                  fVar239 = local_1b98.v[3] * fVar240 +
                                            auVar86._12_4_ * fVar268 + auVar98._12_4_ * fVar20;
                                  auVar86 = vrcpps_avx(auVar85);
                                  fVar249 = auVar86._0_4_;
                                  auVar174._0_4_ = auVar85._0_4_ * fVar249;
                                  fVar227 = auVar86._4_4_;
                                  auVar174._4_4_ = auVar85._4_4_ * fVar227;
                                  fVar257 = auVar86._8_4_;
                                  auVar174._8_4_ = auVar85._8_4_ * fVar257;
                                  fVar238 = auVar86._12_4_;
                                  auVar174._12_4_ = auVar85._12_4_ * fVar238;
                                  auVar201._8_4_ = 0x3f800000;
                                  auVar201._0_8_ = &DAT_3f8000003f800000;
                                  auVar201._12_4_ = 0x3f800000;
                                  auVar86 = vsubps_avx(auVar201,auVar174);
                                  auVar271._0_4_ =
                                       (fVar58 + fVar58) * (fVar249 + fVar249 * auVar86._0_4_);
                                  auVar271._4_4_ =
                                       (fVar102 + fVar102) * (fVar227 + fVar227 * auVar86._4_4_);
                                  auVar271._8_4_ =
                                       (fVar136 + fVar136) * (fVar257 + fVar257 * auVar86._8_4_);
                                  auVar271._12_4_ =
                                       (fVar239 + fVar239) * (fVar238 + fVar238 * auVar86._12_4_);
                                  auVar86 = vcmpps_avx(auVar271,*(undefined1 (*) [16])(ray + 0x80),2
                                                      );
                                  auVar87 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar271,2
                                                      );
                                  auVar86 = vandps_avx(auVar87,auVar86);
                                  auVar87 = vcmpps_avx(auVar85,_DAT_01feba10,4);
                                  auVar86 = vandps_avx(auVar87,auVar86);
                                  auVar86 = vpslld_avx(auVar86,0x1f);
                                  auVar87 = vpsrad_avx(auVar86,0x1f);
                                  auVar86 = auVar66 & auVar87;
                                  auVar66 = vandps_avx(auVar66,auVar87);
                                  auVar98 = auVar228;
                                  auVar87 = *(undefined1 (*) [16])pRVar1;
                                  if ((((auVar86 >> 0x1f & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0 &&
                                       (auVar86 >> 0x3f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar86 >> 0x5f & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) && -1 < auVar86[0xf])
                                  goto LAB_0033b93a;
                                  auVar86 = vpcmpeqd_avx(auVar228,auVar228);
                                  _local_1bb8 = auVar252;
                                  local_1c38 = auVar253;
                                  local_1c28 = auVar271;
                                }
                                auVar294 = ZEXT1664(auVar86);
                                auVar284 = ZEXT1664(CONCAT412(0x7f800000,
                                                              CONCAT48(0x7f800000,0x7f8000007f800000
                                                                      )));
                                auVar87 = local_1c78;
                                if ((((auVar66 >> 0x1f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0 ||
                                     (auVar66 >> 0x3f & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                    (auVar66 >> 0x5f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) || auVar66[0xf] < '\0') {
                                  auVar88._0_4_ = (float)(int)(*(ushort *)(lVar16 + 8 + lVar51) - 1)
                                  ;
                                  auVar88._4_12_ = auVar297;
                                  auVar87 = vrcpss_avx(auVar88,auVar88);
                                  auVar120._0_4_ =
                                       (float)(int)(*(ushort *)(lVar16 + 10 + lVar51) - 1);
                                  auVar120._4_12_ = auVar297;
                                  auVar143._0_4_ = (float)(((uint)uVar42 & 1) + uVar37);
                                  auVar143._4_12_ = auVar297;
                                  auVar228 = vshufps_avx(auVar143,auVar143,0);
                                  fVar249 = local_1be8._0_4_;
                                  fVar227 = local_1be8._4_4_;
                                  fVar257 = local_1be8._8_4_;
                                  fVar238 = local_1be8._12_4_;
                                  auVar87 = ZEXT416((uint)(auVar87._0_4_ *
                                                          (2.0 - auVar87._0_4_ * auVar88._0_4_)));
                                  auVar87 = vshufps_avx(auVar87,auVar87,0);
                                  auVar89._0_4_ =
                                       (local_1bb8._0_4_ + auVar228._0_4_ * fVar249) * auVar87._0_4_
                                  ;
                                  auVar89._4_4_ =
                                       (local_1bb8._4_4_ + auVar228._4_4_ * fVar227) * auVar87._4_4_
                                  ;
                                  auVar89._8_4_ =
                                       (local_1bb8._8_4_ + auVar228._8_4_ * fVar257) * auVar87._8_4_
                                  ;
                                  auVar89._12_4_ =
                                       (local_1bb8._12_4_ + auVar228._12_4_ * fVar238) *
                                       auVar87._12_4_;
                                  auVar87 = vrcpss_avx(auVar120,auVar120);
                                  _local_1bb8 = vblendvps_avx(_local_1bb8,auVar89,auVar66);
                                  auVar121._0_4_ =
                                       (float)(int)(((uint)(uVar42 >> 1) & 0x7fffffff) + uVar40);
                                  auVar121._4_12_ = auVar297;
                                  auVar228 = vshufps_avx(auVar121,auVar121,0);
                                  auVar87 = ZEXT416((uint)(auVar87._0_4_ *
                                                          (2.0 - auVar87._0_4_ * auVar120._0_4_)));
                                  auVar87 = vshufps_avx(auVar87,auVar87,0);
                                  auVar90._0_4_ =
                                       (local_1c38._0_4_ + auVar228._0_4_ * fVar249) * auVar87._0_4_
                                  ;
                                  auVar90._4_4_ =
                                       (local_1c38._4_4_ + auVar228._4_4_ * fVar227) * auVar87._4_4_
                                  ;
                                  auVar90._8_4_ =
                                       (local_1c38._8_4_ + auVar228._8_4_ * fVar257) * auVar87._8_4_
                                  ;
                                  auVar90._12_4_ =
                                       (local_1c38._12_4_ + auVar228._12_4_ * fVar238) *
                                       auVar87._12_4_;
                                  local_1c38 = vblendvps_avx(local_1c38,auVar90,auVar66);
                                  pGVar15 = (context->scene->geometries).items
                                            [(uint)lower_z.field_0.i[uVar42]].ptr;
                                  uVar35 = pGVar15->mask;
                                  auVar91._4_4_ = uVar35;
                                  auVar91._0_4_ = uVar35;
                                  auVar91._8_4_ = uVar35;
                                  auVar91._12_4_ = uVar35;
                                  auVar87 = vandps_avx(auVar91,*(undefined1 (*) [16])(ray + 0x90));
                                  auVar87 = vpcmpeqd_avx(auVar87,_DAT_01feba10);
                                  auVar98 = auVar66 & ~auVar87;
                                  auVar228 = local_1c78;
                                  if ((((auVar98 >> 0x1f & (undefined1  [16])0x1) !=
                                        (undefined1  [16])0x0 ||
                                       (auVar98 >> 0x3f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                      (auVar98 >> 0x5f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) || auVar98[0xf] < '\0') {
                                    aVar99 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                             vandnps_avx(auVar87,auVar66);
                                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                       (pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                      auVar87 = vandps_avx(local_1be8,auVar220);
                                      auVar228 = vrcpps_avx(local_1be8);
                                      fVar136 = auVar228._0_4_;
                                      auVar183._0_4_ = fVar249 * fVar136;
                                      fVar249 = auVar228._4_4_;
                                      auVar183._4_4_ = fVar227 * fVar249;
                                      fVar227 = auVar228._8_4_;
                                      auVar183._8_4_ = fVar257 * fVar227;
                                      fVar257 = auVar228._12_4_;
                                      auVar183._12_4_ = fVar238 * fVar257;
                                      auVar206._8_4_ = 0x3f800000;
                                      auVar206._0_8_ = &DAT_3f8000003f800000;
                                      auVar206._12_4_ = 0x3f800000;
                                      auVar228 = vsubps_avx(auVar206,auVar183);
                                      auVar151._0_4_ = fVar136 + fVar136 * auVar228._0_4_;
                                      auVar151._4_4_ = fVar249 + fVar249 * auVar228._4_4_;
                                      auVar151._8_4_ = fVar227 + fVar227 * auVar228._8_4_;
                                      auVar151._12_4_ = fVar257 + fVar257 * auVar228._12_4_;
                                      auVar184._8_4_ = 0x219392ef;
                                      auVar184._0_8_ = 0x219392ef219392ef;
                                      auVar184._12_4_ = 0x219392ef;
                                      auVar87 = vcmpps_avx(auVar87,auVar184,5);
                                      auVar87 = vandps_avx(auVar87,auVar151);
                                      auVar152._0_4_ = local_1bb8._0_4_ * auVar87._0_4_;
                                      auVar152._4_4_ = local_1bb8._4_4_ * auVar87._4_4_;
                                      auVar152._8_4_ = local_1bb8._8_4_ * auVar87._8_4_;
                                      auVar152._12_4_ = local_1bb8._12_4_ * auVar87._12_4_;
                                      vminps_avx(auVar152,auVar206);
                                      auVar129._0_4_ = local_1c38._0_4_ * auVar87._0_4_;
                                      auVar129._4_4_ = local_1c38._4_4_ * auVar87._4_4_;
                                      auVar129._8_4_ = local_1c38._8_4_ * auVar87._8_4_;
                                      auVar129._12_4_ = local_1c38._12_4_ * auVar87._12_4_;
                                      auVar87 = vminps_avx(auVar129,auVar206);
                                      vpshufd_avx(ZEXT416((uint)lower_z.field_0.i[uVar42]),0);
                                      vpshufd_avx(ZEXT416((uint)upper_z.field_0.i[uVar42]),0);
                                      upper_x.field_0 = local_1b98;
                                      vcmpps_avx(ZEXT1632(auVar87),ZEXT1632(auVar87),0xf);
                                      auVar87 = *(undefined1 (*) [16])(ray + 0x80);
                                      auVar228 = vblendvps_avx(auVar87,local_1c28,
                                                               (undefined1  [16])aVar99);
                                      *(undefined1 (*) [16])(ray + 0x80) = auVar228;
                                      upper_y.field_0 = aVar99;
                                      lower_y.field_0._0_8_ = &upper_y;
                                      lower_y.field_0._8_8_ = pGVar15->userPtr;
                                      if (pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                        (*pGVar15->occlusionFilterN)
                                                  ((RTCFilterFunctionNArguments *)&lower_y);
                                        auVar284 = ZEXT1664(CONCAT412(0x7f800000,
                                                                      CONCAT48(0x7f800000,
                                                                               0x7f8000007f800000)))
                                        ;
                                      }
                                      if (upper_y.field_0 ==
                                          (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)0x0) {
                                        auVar228 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10)
                                        ;
                                        auVar86 = vpcmpeqd_avx(auVar86,auVar86);
                                        auVar294 = ZEXT1664(auVar86);
                                        auVar86 = auVar86 ^ auVar228;
                                      }
                                      else {
                                        p_Var18 = context->args->filter;
                                        auVar86 = vpcmpeqd_avx(auVar86,auVar86);
                                        auVar294 = ZEXT1664(auVar86);
                                        if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                                           (((context->args->flags &
                                             RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                            (((pGVar15->field_8).field_0x2 & 0x40) != 0)))) {
                                          (*p_Var18)((RTCFilterFunctionNArguments *)&lower_y);
                                          auVar86 = vpcmpeqd_avx(auVar86,auVar86);
                                          auVar294 = ZEXT1664(auVar86);
                                          auVar284 = ZEXT1664(CONCAT412(0x7f800000,
                                                                        CONCAT48(0x7f800000,
                                                                                 0x7f8000007f800000)
                                                                       ));
                                        }
                                        auVar228 = vpcmpeqd_avx((undefined1  [16])0x0,
                                                                (undefined1  [16])upper_y.field_0);
                                        auVar86 = auVar294._0_16_ ^ auVar228;
                                        auVar153._8_4_ = 0xff800000;
                                        auVar153._0_8_ = 0xff800000ff800000;
                                        auVar153._12_4_ = 0xff800000;
                                        auVar228 = vblendvps_avx(auVar153,*(undefined1 (*) [16])
                                                                           (ray + 0x80),auVar228);
                                        *(undefined1 (*) [16])(ray + 0x80) = auVar228;
                                      }
                                      auVar86 = vpslld_avx(auVar86,0x1f);
                                      aVar99 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                               vpsrad_avx(auVar86,0x1f);
                                      auVar86 = vblendvps_avx(auVar87,*(undefined1 (*) [16])pRVar2,
                                                              auVar86);
                                      *(undefined1 (*) [16])pRVar2 = auVar86;
                                    }
                                    auVar228 = vpandn_avx((undefined1  [16])aVar99,local_1c78);
                                  }
                                  auVar87 = vandnps_avx(auVar66,local_1c78);
                                  local_1c78 = auVar228;
                                }
                                if ((((auVar87 >> 0x1f & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar87 >> 0x3f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar87 >> 0x5f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) && -1 < auVar87[0xf]) {
                                  local_1b88 = local_1be8;
                                  local_1b68.v = local_1b98.v;
                                }
                                else {
                                  auVar66 = *(undefined1 (*) [16])ray;
                                  auVar86 = *(undefined1 (*) [16])(ray + 0x10);
                                  auVar87 = *(undefined1 (*) [16])(ray + 0x20);
                                  auVar31._4_4_ = uVar39;
                                  auVar31._0_4_ = uVar39;
                                  auVar31._8_4_ = uVar39;
                                  auVar31._12_4_ = uVar39;
                                  auVar228 = vsubps_avx(auVar31,auVar66);
                                  auVar30._4_4_ = uVar8;
                                  auVar30._0_4_ = uVar8;
                                  auVar30._8_4_ = uVar8;
                                  auVar30._12_4_ = uVar8;
                                  auVar98 = vsubps_avx(auVar30,auVar86);
                                  auVar29._4_4_ = uVar9;
                                  auVar29._0_4_ = uVar9;
                                  auVar29._8_4_ = uVar9;
                                  auVar29._12_4_ = uVar9;
                                  auVar250 = vsubps_avx(auVar29,auVar87);
                                  auVar261 = vsubps_avx(auVar77,auVar66);
                                  auVar262 = vsubps_avx(auVar215,auVar86);
                                  auVar282 = vsubps_avx(auVar229,auVar87);
                                  auVar66 = vsubps_avx(auVar232,auVar66);
                                  auVar111 = vsubps_avx(auVar78,auVar86);
                                  auVar86 = vsubps_avx(auVar79,auVar87);
                                  auVar87 = vsubps_avx(auVar66,auVar228);
                                  auVar22 = vsubps_avx(auVar111,auVar98);
                                  auVar23 = vsubps_avx(auVar86,auVar250);
                                  fVar249 = auVar98._0_4_;
                                  fVar58 = auVar111._0_4_ + fVar249;
                                  fVar257 = auVar98._4_4_;
                                  fVar102 = auVar111._4_4_ + fVar257;
                                  fVar136 = auVar98._8_4_;
                                  fVar104 = auVar111._8_4_ + fVar136;
                                  fVar20 = auVar98._12_4_;
                                  fVar106 = auVar111._12_4_ + fVar20;
                                  fVar281 = auVar250._0_4_;
                                  fVar211 = fVar281 + auVar86._0_4_;
                                  fVar285 = auVar250._4_4_;
                                  fVar224 = fVar285 + auVar86._4_4_;
                                  fVar286 = auVar250._8_4_;
                                  fVar225 = fVar286 + auVar86._8_4_;
                                  fVar287 = auVar250._12_4_;
                                  fVar226 = fVar287 + auVar86._12_4_;
                                  fVar267 = auVar23._0_4_;
                                  auVar254._0_4_ = fVar267 * fVar58;
                                  fVar269 = auVar23._4_4_;
                                  auVar254._4_4_ = fVar269 * fVar102;
                                  fVar277 = auVar23._8_4_;
                                  auVar254._8_4_ = fVar277 * fVar104;
                                  fVar279 = auVar23._12_4_;
                                  auVar254._12_4_ = fVar279 * fVar106;
                                  fVar159 = auVar22._0_4_;
                                  auVar265._0_4_ = fVar159 * fVar211;
                                  fVar160 = auVar22._4_4_;
                                  auVar265._4_4_ = fVar160 * fVar224;
                                  fVar162 = auVar22._8_4_;
                                  auVar265._8_4_ = fVar162 * fVar225;
                                  fVar163 = auVar22._12_4_;
                                  auVar265._12_4_ = fVar163 * fVar226;
                                  auVar22 = vsubps_avx(auVar265,auVar254);
                                  fVar227 = auVar228._0_4_;
                                  fVar248 = auVar66._0_4_ + fVar227;
                                  fVar238 = auVar228._4_4_;
                                  fVar255 = auVar66._4_4_ + fVar238;
                                  fVar239 = auVar228._8_4_;
                                  fVar256 = auVar66._8_4_ + fVar239;
                                  fVar240 = auVar228._12_4_;
                                  fVar258 = auVar66._12_4_ + fVar240;
                                  fVar107 = auVar87._0_4_;
                                  auVar245._0_4_ = fVar107 * fVar211;
                                  fVar132 = auVar87._4_4_;
                                  auVar245._4_4_ = fVar132 * fVar224;
                                  fVar134 = auVar87._8_4_;
                                  auVar245._8_4_ = fVar134 * fVar225;
                                  fVar137 = auVar87._12_4_;
                                  auVar245._12_4_ = fVar137 * fVar226;
                                  auVar272._0_4_ = fVar248 * fVar267;
                                  auVar272._4_4_ = fVar255 * fVar269;
                                  auVar272._8_4_ = fVar256 * fVar277;
                                  auVar272._12_4_ = fVar258 * fVar279;
                                  auVar87 = vsubps_avx(auVar272,auVar245);
                                  auVar246._0_4_ = fVar248 * fVar159;
                                  auVar246._4_4_ = fVar255 * fVar160;
                                  auVar246._8_4_ = fVar256 * fVar162;
                                  auVar246._12_4_ = fVar258 * fVar163;
                                  auVar235._0_4_ = fVar107 * fVar58;
                                  auVar235._4_4_ = fVar132 * fVar102;
                                  auVar235._8_4_ = fVar134 * fVar104;
                                  auVar235._12_4_ = fVar137 * fVar106;
                                  auVar23 = vsubps_avx(auVar235,auVar246);
                                  fVar211 = *(float *)(ray + 0x60);
                                  fVar224 = *(float *)(ray + 100);
                                  fVar225 = *(float *)(ray + 0x68);
                                  auVar32 = *(undefined1 (*) [12])(ray + 0x60);
                                  fVar226 = *(float *)(ray + 0x6c);
                                  auVar297 = *(undefined1 (*) [12])(ray + 0x50);
                                  fVar248 = *(float *)(ray + 0x5c);
                                  fVar255 = *(float *)(ray + 0x40);
                                  fVar256 = *(float *)(ray + 0x44);
                                  fVar258 = *(float *)(ray + 0x48);
                                  auVar33 = *(undefined1 (*) [12])(ray + 0x40);
                                  fVar24 = *(float *)(ray + 0x4c);
                                  auVar247._0_4_ =
                                       auVar22._0_4_ * fVar255 +
                                       auVar87._0_4_ * *(float *)(ray + 0x50) +
                                       fVar211 * auVar23._0_4_;
                                  auVar247._4_4_ =
                                       auVar22._4_4_ * fVar256 +
                                       auVar87._4_4_ * *(float *)(ray + 0x54) +
                                       fVar224 * auVar23._4_4_;
                                  auVar247._8_4_ =
                                       auVar22._8_4_ * fVar258 +
                                       auVar87._8_4_ * *(float *)(ray + 0x58) +
                                       fVar225 * auVar23._8_4_;
                                  auVar247._12_4_ =
                                       auVar22._12_4_ * fVar24 +
                                       auVar87._12_4_ * fVar248 + fVar226 * auVar23._12_4_;
                                  auVar87 = vsubps_avx(auVar98,auVar262);
                                  auVar98 = vsubps_avx(auVar250,auVar282);
                                  fVar190 = auVar262._0_4_ + fVar249;
                                  fVar208 = auVar262._4_4_ + fVar257;
                                  fVar209 = auVar262._8_4_ + fVar136;
                                  fVar210 = auVar262._12_4_ + fVar20;
                                  fVar108 = fVar281 + auVar282._0_4_;
                                  fVar133 = fVar285 + auVar282._4_4_;
                                  fVar135 = fVar286 + auVar282._8_4_;
                                  fVar138 = fVar287 + auVar282._12_4_;
                                  fVar58 = auVar98._0_4_;
                                  auVar273._0_4_ = fVar190 * fVar58;
                                  fVar102 = auVar98._4_4_;
                                  auVar273._4_4_ = fVar208 * fVar102;
                                  fVar104 = auVar98._8_4_;
                                  auVar273._8_4_ = fVar209 * fVar104;
                                  fVar106 = auVar98._12_4_;
                                  auVar273._12_4_ = fVar210 * fVar106;
                                  fVar57 = auVar87._0_4_;
                                  auVar144._0_4_ = fVar57 * fVar108;
                                  fVar101 = auVar87._4_4_;
                                  auVar144._4_4_ = fVar101 * fVar133;
                                  fVar103 = auVar87._8_4_;
                                  auVar144._8_4_ = fVar103 * fVar135;
                                  fVar105 = auVar87._12_4_;
                                  auVar144._12_4_ = fVar105 * fVar138;
                                  auVar98 = vsubps_avx(auVar144,auVar273);
                                  auVar228 = vsubps_avx(auVar228,auVar261);
                                  fVar268 = auVar228._0_4_;
                                  auVar122._0_4_ = fVar268 * fVar108;
                                  fVar276 = auVar228._4_4_;
                                  auVar122._4_4_ = fVar276 * fVar133;
                                  fVar278 = auVar228._8_4_;
                                  auVar122._8_4_ = fVar278 * fVar135;
                                  fVar280 = auVar228._12_4_;
                                  auVar122._12_4_ = fVar280 * fVar138;
                                  fVar108 = fVar227 + auVar261._0_4_;
                                  fVar133 = fVar238 + auVar261._4_4_;
                                  fVar135 = fVar239 + auVar261._8_4_;
                                  fVar138 = fVar240 + auVar261._12_4_;
                                  auVar236._0_4_ = fVar58 * fVar108;
                                  auVar236._4_4_ = fVar102 * fVar133;
                                  auVar236._8_4_ = fVar104 * fVar135;
                                  auVar236._12_4_ = fVar106 * fVar138;
                                  auVar228 = vsubps_avx(auVar236,auVar122);
                                  auVar221._0_4_ = fVar108 * fVar57;
                                  auVar221._4_4_ = fVar133 * fVar101;
                                  auVar221._8_4_ = fVar135 * fVar103;
                                  auVar221._12_4_ = fVar138 * fVar105;
                                  auVar237._0_4_ = fVar268 * fVar190;
                                  auVar237._4_4_ = fVar276 * fVar208;
                                  auVar237._8_4_ = fVar278 * fVar209;
                                  auVar237._12_4_ = fVar280 * fVar210;
                                  auVar250 = vsubps_avx(auVar237,auVar221);
                                  fVar165 = auVar297._0_4_;
                                  fVar187 = auVar297._4_4_;
                                  fVar188 = auVar297._8_4_;
                                  auVar222._0_4_ =
                                       fVar255 * auVar98._0_4_ +
                                       fVar211 * auVar250._0_4_ + fVar165 * auVar228._0_4_;
                                  auVar222._4_4_ =
                                       fVar256 * auVar98._4_4_ +
                                       fVar224 * auVar250._4_4_ + fVar187 * auVar228._4_4_;
                                  auVar222._8_4_ =
                                       fVar258 * auVar98._8_4_ +
                                       fVar225 * auVar250._8_4_ + fVar188 * auVar228._8_4_;
                                  auVar222._12_4_ =
                                       fVar24 * auVar98._12_4_ +
                                       fVar226 * auVar250._12_4_ + fVar248 * auVar228._12_4_;
                                  auVar228 = vsubps_avx(auVar261,auVar66);
                                  fVar108 = auVar66._0_4_ + auVar261._0_4_;
                                  fVar133 = auVar66._4_4_ + auVar261._4_4_;
                                  fVar135 = auVar66._8_4_ + auVar261._8_4_;
                                  fVar138 = auVar66._12_4_ + auVar261._12_4_;
                                  auVar66 = vsubps_avx(auVar262,auVar111);
                                  fVar190 = auVar262._0_4_ + auVar111._0_4_;
                                  fVar208 = auVar262._4_4_ + auVar111._4_4_;
                                  fVar209 = auVar262._8_4_ + auVar111._8_4_;
                                  fVar210 = auVar262._12_4_ + auVar111._12_4_;
                                  auVar98 = vsubps_avx(auVar282,auVar86);
                                  fVar139 = auVar282._0_4_ + auVar86._0_4_;
                                  fVar158 = auVar282._4_4_ + auVar86._4_4_;
                                  fVar161 = auVar282._8_4_ + auVar86._8_4_;
                                  fVar164 = auVar282._12_4_ + auVar86._12_4_;
                                  fVar189 = auVar98._0_4_;
                                  auVar283._0_4_ = fVar189 * fVar190;
                                  fVar259 = auVar98._4_4_;
                                  auVar283._4_4_ = fVar259 * fVar208;
                                  fVar260 = auVar98._8_4_;
                                  auVar283._8_4_ = fVar260 * fVar209;
                                  fVar266 = auVar98._12_4_;
                                  auVar283._12_4_ = fVar266 * fVar210;
                                  fVar288 = auVar66._0_4_;
                                  auVar202._0_4_ = fVar288 * fVar139;
                                  fVar290 = auVar66._4_4_;
                                  auVar202._4_4_ = fVar290 * fVar158;
                                  fVar291 = auVar66._8_4_;
                                  auVar202._8_4_ = fVar291 * fVar161;
                                  fVar292 = auVar66._12_4_;
                                  auVar202._12_4_ = fVar292 * fVar164;
                                  auVar66 = vsubps_avx(auVar202,auVar283);
                                  fVar295 = auVar228._0_4_;
                                  auVar145._0_4_ = fVar295 * fVar139;
                                  fVar139 = auVar228._4_4_;
                                  auVar145._4_4_ = fVar139 * fVar158;
                                  fVar158 = auVar228._8_4_;
                                  auVar145._8_4_ = fVar158 * fVar161;
                                  fVar161 = auVar228._12_4_;
                                  auVar145._12_4_ = fVar161 * fVar164;
                                  auVar203._0_4_ = fVar189 * fVar108;
                                  auVar203._4_4_ = fVar259 * fVar133;
                                  auVar203._8_4_ = fVar260 * fVar135;
                                  auVar203._12_4_ = fVar266 * fVar138;
                                  auVar86 = vsubps_avx(auVar203,auVar145);
                                  auVar92._0_4_ = fVar288 * fVar108;
                                  auVar92._4_4_ = fVar290 * fVar133;
                                  auVar92._8_4_ = fVar291 * fVar135;
                                  auVar92._12_4_ = fVar292 * fVar138;
                                  auVar123._0_4_ = fVar295 * fVar190;
                                  auVar123._4_4_ = fVar139 * fVar208;
                                  auVar123._8_4_ = fVar158 * fVar209;
                                  auVar123._12_4_ = fVar161 * fVar210;
                                  auVar98 = vsubps_avx(auVar123,auVar92);
                                  auVar93._0_4_ =
                                       auVar66._0_4_ * fVar255 +
                                       fVar211 * auVar98._0_4_ + fVar165 * auVar86._0_4_;
                                  auVar93._4_4_ =
                                       auVar66._4_4_ * fVar256 +
                                       fVar224 * auVar98._4_4_ + fVar187 * auVar86._4_4_;
                                  auVar93._8_4_ =
                                       auVar66._8_4_ * fVar258 +
                                       fVar225 * auVar98._8_4_ + fVar188 * auVar86._8_4_;
                                  auVar93._12_4_ =
                                       auVar66._12_4_ * fVar24 +
                                       fVar226 * auVar98._12_4_ + fVar248 * auVar86._12_4_;
                                  local_1b88._0_4_ = auVar93._0_4_ + auVar247._0_4_ + auVar222._0_4_
                                  ;
                                  local_1b88._4_4_ = auVar93._4_4_ + auVar247._4_4_ + auVar222._4_4_
                                  ;
                                  local_1b88._8_4_ = auVar93._8_4_ + auVar247._8_4_ + auVar222._8_4_
                                  ;
                                  local_1b88._12_4_ =
                                       auVar93._12_4_ + auVar247._12_4_ + auVar222._12_4_;
                                  auVar146._8_4_ = 0x7fffffff;
                                  auVar146._0_8_ = 0x7fffffff7fffffff;
                                  auVar146._12_4_ = 0x7fffffff;
                                  auVar66 = vandps_avx(local_1b88,auVar146);
                                  auVar124._0_4_ = auVar66._0_4_ * 1.1920929e-07;
                                  auVar124._4_4_ = auVar66._4_4_ * 1.1920929e-07;
                                  auVar124._8_4_ = auVar66._8_4_ * 1.1920929e-07;
                                  auVar124._12_4_ = auVar66._12_4_ * 1.1920929e-07;
                                  auVar66 = vminps_avx(auVar247,auVar222);
                                  auVar66 = vminps_avx(auVar66,auVar93);
                                  uVar47 = CONCAT44(auVar124._4_4_,auVar124._0_4_);
                                  auVar175._0_8_ = uVar47 ^ 0x8000000080000000;
                                  auVar175._8_4_ = -auVar124._8_4_;
                                  auVar175._12_4_ = -auVar124._12_4_;
                                  auVar66 = vcmpps_avx(auVar66,auVar175,5);
                                  auVar86 = vmaxps_avx(auVar247,auVar222);
                                  auVar86 = vmaxps_avx(auVar86,auVar93);
                                  auVar86 = vcmpps_avx(auVar86,auVar124,2);
                                  auVar66 = vorps_avx(auVar66,auVar86);
                                  auVar86 = local_1c78 & auVar66;
                                  auVar66 = vandps_avx(auVar66,local_1c78);
                                  if ((((auVar86 >> 0x1f & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0 &&
                                       (auVar86 >> 0x3f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar86 >> 0x5f & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) && -1 < auVar86[0xf]) {
LAB_0033b995:
                                    local_1b88 = local_1be8;
                                    local_1b68.v = local_1b98.v;
                                    auVar86 = vpcmpeqd_avx(auVar111,auVar111);
                                  }
                                  else {
                                    auVar94._0_4_ = fVar57 * fVar267;
                                    auVar94._4_4_ = fVar101 * fVar269;
                                    auVar94._8_4_ = fVar103 * fVar277;
                                    auVar94._12_4_ = fVar105 * fVar279;
                                    auVar125._0_4_ = fVar58 * fVar159;
                                    auVar125._4_4_ = fVar102 * fVar160;
                                    auVar125._8_4_ = fVar104 * fVar162;
                                    auVar125._12_4_ = fVar106 * fVar163;
                                    auVar250 = vsubps_avx(auVar125,auVar94);
                                    auVar147._0_4_ = fVar58 * fVar288;
                                    auVar147._4_4_ = fVar102 * fVar290;
                                    auVar147._8_4_ = fVar104 * fVar291;
                                    auVar147._12_4_ = fVar106 * fVar292;
                                    auVar176._0_4_ = fVar57 * fVar189;
                                    auVar176._4_4_ = fVar101 * fVar259;
                                    auVar176._8_4_ = fVar103 * fVar260;
                                    auVar176._12_4_ = fVar105 * fVar266;
                                    auVar261 = vsubps_avx(auVar176,auVar147);
                                    auVar86 = vandps_avx(auVar94,auVar146);
                                    auVar98 = vandps_avx(auVar147,auVar146);
                                    auVar86 = vcmpps_avx(auVar86,auVar98,1);
                                    local_1b68 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                                 vblendvps_avx(auVar261,auVar250,auVar86);
                                    auVar95._0_4_ = fVar268 * fVar189;
                                    auVar95._4_4_ = fVar276 * fVar259;
                                    auVar95._8_4_ = fVar278 * fVar260;
                                    auVar95._12_4_ = fVar280 * fVar266;
                                    auVar126._0_4_ = fVar268 * fVar267;
                                    auVar126._4_4_ = fVar276 * fVar269;
                                    auVar126._8_4_ = fVar278 * fVar277;
                                    auVar126._12_4_ = fVar280 * fVar279;
                                    auVar148._0_4_ = fVar107 * fVar58;
                                    auVar148._4_4_ = fVar132 * fVar102;
                                    auVar148._8_4_ = fVar134 * fVar104;
                                    auVar148._12_4_ = fVar137 * fVar106;
                                    auVar250 = vsubps_avx(auVar126,auVar148);
                                    auVar177._0_4_ = fVar295 * fVar58;
                                    auVar177._4_4_ = fVar139 * fVar102;
                                    auVar177._8_4_ = fVar158 * fVar104;
                                    auVar177._12_4_ = fVar161 * fVar106;
                                    auVar261 = vsubps_avx(auVar177,auVar95);
                                    auVar86 = vandps_avx(auVar148,auVar146);
                                    auVar98 = vandps_avx(auVar95,auVar146);
                                    auVar86 = vcmpps_avx(auVar86,auVar98,1);
                                    auVar250 = vblendvps_avx(auVar261,auVar250,auVar86);
                                    auVar96._0_4_ = fVar295 * fVar57;
                                    auVar96._4_4_ = fVar139 * fVar101;
                                    auVar96._8_4_ = fVar158 * fVar103;
                                    auVar96._12_4_ = fVar161 * fVar105;
                                    auVar127._0_4_ = fVar107 * fVar57;
                                    auVar127._4_4_ = fVar132 * fVar101;
                                    auVar127._8_4_ = fVar134 * fVar103;
                                    auVar127._12_4_ = fVar137 * fVar105;
                                    auVar149._0_4_ = fVar268 * fVar159;
                                    auVar149._4_4_ = fVar276 * fVar160;
                                    auVar149._8_4_ = fVar278 * fVar162;
                                    auVar149._12_4_ = fVar280 * fVar163;
                                    auVar178._0_4_ = fVar268 * fVar288;
                                    auVar178._4_4_ = fVar276 * fVar290;
                                    auVar178._8_4_ = fVar278 * fVar291;
                                    auVar178._12_4_ = fVar280 * fVar292;
                                    auVar261 = vsubps_avx(auVar127,auVar149);
                                    auVar262 = vsubps_avx(auVar178,auVar96);
                                    auVar86 = vandps_avx(auVar149,auVar146);
                                    auVar98 = vandps_avx(auVar96,auVar146);
                                    auVar86 = vcmpps_avx(auVar86,auVar98,1);
                                    auVar86 = vblendvps_avx(auVar262,auVar261,auVar86);
                                    local_1ba8 = auVar32._0_4_;
                                    fStack_1ba4 = auVar32._4_4_;
                                    fStack_1ba0 = auVar32._8_4_;
                                    local_1ac8 = auVar33._0_4_;
                                    fStack_1ac4 = auVar33._4_4_;
                                    fStack_1ac0 = auVar33._8_4_;
                                    fVar58 = local_1b68.v[0] * local_1ac8 +
                                             auVar86._0_4_ * local_1ba8 + fVar165 * auVar250._0_4_;
                                    fVar102 = local_1b68.v[1] * fStack_1ac4 +
                                              auVar86._4_4_ * fStack_1ba4 + fVar187 * auVar250._4_4_
                                    ;
                                    fVar104 = local_1b68.v[2] * fStack_1ac0 +
                                              auVar86._8_4_ * fStack_1ba0 + fVar188 * auVar250._8_4_
                                    ;
                                    fVar106 = local_1b68.v[3] * fVar24 +
                                              auVar86._12_4_ * fVar226 + fVar248 * auVar250._12_4_;
                                    auVar97._0_4_ = fVar58 + fVar58;
                                    auVar97._4_4_ = fVar102 + fVar102;
                                    auVar97._8_4_ = fVar104 + fVar104;
                                    auVar97._12_4_ = fVar106 + fVar106;
                                    fVar58 = local_1b68.v[0] * fVar227 +
                                             auVar86._0_4_ * fVar281 + auVar250._0_4_ * fVar249;
                                    fVar102 = local_1b68.v[1] * fVar238 +
                                              auVar86._4_4_ * fVar285 + auVar250._4_4_ * fVar257;
                                    fVar136 = local_1b68.v[2] * fVar239 +
                                              auVar86._8_4_ * fVar286 + auVar250._8_4_ * fVar136;
                                    fVar239 = local_1b68.v[3] * fVar240 +
                                              auVar86._12_4_ * fVar287 + auVar250._12_4_ * fVar20;
                                    auVar86 = vrcpps_avx(auVar97);
                                    fVar249 = auVar86._0_4_;
                                    auVar179._0_4_ = auVar97._0_4_ * fVar249;
                                    fVar227 = auVar86._4_4_;
                                    auVar179._4_4_ = auVar97._4_4_ * fVar227;
                                    fVar257 = auVar86._8_4_;
                                    auVar179._8_4_ = auVar97._8_4_ * fVar257;
                                    fVar238 = auVar86._12_4_;
                                    auVar179._12_4_ = auVar97._12_4_ * fVar238;
                                    auVar204._8_4_ = 0x3f800000;
                                    auVar204._0_8_ = &DAT_3f8000003f800000;
                                    auVar204._12_4_ = 0x3f800000;
                                    auVar86 = vsubps_avx(auVar204,auVar179);
                                    auVar274._0_4_ =
                                         (fVar58 + fVar58) * (fVar249 + fVar249 * auVar86._0_4_);
                                    auVar274._4_4_ =
                                         (fVar102 + fVar102) * (fVar227 + fVar227 * auVar86._4_4_);
                                    auVar274._8_4_ =
                                         (fVar136 + fVar136) * (fVar257 + fVar257 * auVar86._8_4_);
                                    auVar274._12_4_ =
                                         (fVar239 + fVar239) * (fVar238 + fVar238 * auVar86._12_4_);
                                    auVar86 = vcmpps_avx(auVar274,*(undefined1 (*) [16])(ray + 0x80)
                                                         ,2);
                                    auVar98 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar274
                                                         ,2);
                                    auVar86 = vandps_avx(auVar98,auVar86);
                                    auVar98 = vcmpps_avx(auVar97,_DAT_01feba10,4);
                                    auVar86 = vandps_avx(auVar98,auVar86);
                                    auVar86 = vpslld_avx(auVar86,0x1f);
                                    auVar98 = vpsrad_avx(auVar86,0x1f);
                                    auVar86 = auVar66 & auVar98;
                                    auVar66 = vandps_avx(auVar98,auVar66);
                                    auVar111 = auVar87;
                                    if ((((auVar86 >> 0x1f & (undefined1  [16])0x1) ==
                                          (undefined1  [16])0x0 &&
                                         (auVar86 >> 0x3f & (undefined1  [16])0x1) ==
                                         (undefined1  [16])0x0) &&
                                        (auVar86 >> 0x5f & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0) && -1 < auVar86[0xf])
                                    goto LAB_0033b995;
                                    auVar86 = vpcmpeqd_avx(auVar87,auVar87);
                                    local_1c38 = auVar222;
                                    local_1c28 = auVar274;
                                    _local_1bb8 = auVar247;
                                  }
                                  auVar294 = ZEXT1664(auVar86);
                                  auVar284 = ZEXT1664(CONCAT412(0x7f800000,
                                                                CONCAT48(0x7f800000,
                                                                         0x7f8000007f800000)));
                                  if ((((auVar66 >> 0x1f & (undefined1  [16])0x1) !=
                                        (undefined1  [16])0x0 ||
                                       (auVar66 >> 0x3f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                      (auVar66 >> 0x5f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) || auVar66[0xf] < '\0') {
                                    auVar98 = vsubps_avx(local_1b88,_local_1bb8);
                                    auVar250 = vsubps_avx(local_1b88,local_1c38);
                                    auVar180._0_4_ =
                                         (float)(int)(*(ushort *)(lVar16 + 8 + lVar51) - 1);
                                    auVar297 = auVar228._4_12_;
                                    auVar180._4_12_ = auVar297;
                                    auVar87 = vrcpss_avx(auVar180,auVar180);
                                    auVar223._0_4_ =
                                         (float)(int)(*(ushort *)(lVar16 + 10 + lVar51) - 1);
                                    auVar223._4_12_ = auVar297;
                                    auVar205._0_4_ = (float)(((uint)uVar42 & 1) + uVar37);
                                    auVar205._4_12_ = auVar297;
                                    auVar228 = vshufps_avx(auVar205,auVar205,0);
                                    fVar249 = local_1b88._0_4_;
                                    fVar227 = local_1b88._4_4_;
                                    fVar257 = local_1b88._8_4_;
                                    fVar238 = local_1b88._12_4_;
                                    auVar87 = ZEXT416((uint)(auVar87._0_4_ *
                                                            (2.0 - auVar87._0_4_ * auVar180._0_4_)))
                                    ;
                                    auVar87 = vshufps_avx(auVar87,auVar87,0);
                                    auVar181._0_4_ =
                                         (auVar98._0_4_ + fVar249 * auVar228._0_4_) * auVar87._0_4_;
                                    auVar181._4_4_ =
                                         (auVar98._4_4_ + fVar227 * auVar228._4_4_) * auVar87._4_4_;
                                    auVar181._8_4_ =
                                         (auVar98._8_4_ + fVar257 * auVar228._8_4_) * auVar87._8_4_;
                                    auVar181._12_4_ =
                                         (auVar98._12_4_ + fVar238 * auVar228._12_4_) *
                                         auVar87._12_4_;
                                    auVar87 = vrcpss_avx(auVar223,auVar223);
                                    _local_1bb8 = vblendvps_avx(auVar98,auVar181,auVar66);
                                    auVar182._0_4_ =
                                         (float)(int)(((uint)(uVar42 >> 1) & 0x7fffffff) + uVar40);
                                    auVar182._4_12_ = auVar297;
                                    auVar228 = vshufps_avx(auVar182,auVar182,0);
                                    auVar87 = ZEXT416((uint)(auVar87._0_4_ *
                                                            (2.0 - auVar87._0_4_ * auVar223._0_4_)))
                                    ;
                                    auVar87 = vshufps_avx(auVar87,auVar87,0);
                                    auVar150._0_4_ =
                                         (auVar250._0_4_ + fVar249 * auVar228._0_4_) * auVar87._0_4_
                                    ;
                                    auVar150._4_4_ =
                                         (auVar250._4_4_ + fVar227 * auVar228._4_4_) * auVar87._4_4_
                                    ;
                                    auVar150._8_4_ =
                                         (auVar250._8_4_ + fVar257 * auVar228._8_4_) * auVar87._8_4_
                                    ;
                                    auVar150._12_4_ =
                                         (auVar250._12_4_ + fVar238 * auVar228._12_4_) *
                                         auVar87._12_4_;
                                    local_1c38 = vblendvps_avx(auVar250,auVar150,auVar66);
                                    pGVar15 = (context->scene->geometries).items
                                              [(uint)lower_z.field_0.i[uVar42]].ptr;
                                    uVar35 = pGVar15->mask;
                                    auVar128._4_4_ = uVar35;
                                    auVar128._0_4_ = uVar35;
                                    auVar128._8_4_ = uVar35;
                                    auVar128._12_4_ = uVar35;
                                    auVar87 = vandps_avx(auVar128,*(undefined1 (*) [16])(ray + 0x90)
                                                        );
                                    auVar87 = vpcmpeqd_avx(auVar87,_DAT_01feba10);
                                    auVar228 = auVar66 & ~auVar87;
                                    if ((((auVar228 >> 0x1f & (undefined1  [16])0x1) !=
                                          (undefined1  [16])0x0 ||
                                         (auVar228 >> 0x3f & (undefined1  [16])0x1) !=
                                         (undefined1  [16])0x0) ||
                                        (auVar228 >> 0x5f & (undefined1  [16])0x1) !=
                                        (undefined1  [16])0x0) || auVar228[0xf] < '\0') {
                                      aVar99 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                               vandnps_avx(auVar87,auVar66);
                                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                         (pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                        auVar66 = vandps_avx(local_1b88,auVar146);
                                        auVar87 = vrcpps_avx(local_1b88);
                                        fVar136 = auVar87._0_4_;
                                        auVar185._0_4_ = fVar249 * fVar136;
                                        fVar249 = auVar87._4_4_;
                                        auVar185._4_4_ = fVar227 * fVar249;
                                        fVar227 = auVar87._8_4_;
                                        auVar185._8_4_ = fVar257 * fVar227;
                                        fVar257 = auVar87._12_4_;
                                        auVar185._12_4_ = fVar238 * fVar257;
                                        auVar207._8_4_ = 0x3f800000;
                                        auVar207._0_8_ = &DAT_3f8000003f800000;
                                        auVar207._12_4_ = 0x3f800000;
                                        auVar87 = vsubps_avx(auVar207,auVar185);
                                        auVar154._0_4_ = fVar136 + fVar136 * auVar87._0_4_;
                                        auVar154._4_4_ = fVar249 + fVar249 * auVar87._4_4_;
                                        auVar154._8_4_ = fVar227 + fVar227 * auVar87._8_4_;
                                        auVar154._12_4_ = fVar257 + fVar257 * auVar87._12_4_;
                                        auVar186._8_4_ = 0x219392ef;
                                        auVar186._0_8_ = 0x219392ef219392ef;
                                        auVar186._12_4_ = 0x219392ef;
                                        auVar66 = vcmpps_avx(auVar66,auVar186,5);
                                        auVar66 = vandps_avx(auVar66,auVar154);
                                        auVar155._0_4_ = auVar66._0_4_ * (float)local_1bb8._0_4_;
                                        auVar155._4_4_ = auVar66._4_4_ * (float)local_1bb8._4_4_;
                                        auVar155._8_4_ = auVar66._8_4_ * fStack_1bb0;
                                        auVar155._12_4_ = auVar66._12_4_ * fStack_1bac;
                                        vminps_avx(auVar155,auVar207);
                                        auVar130._0_4_ = local_1c38._0_4_ * auVar66._0_4_;
                                        auVar130._4_4_ = local_1c38._4_4_ * auVar66._4_4_;
                                        auVar130._8_4_ = local_1c38._8_4_ * auVar66._8_4_;
                                        auVar130._12_4_ = local_1c38._12_4_ * auVar66._12_4_;
                                        auVar66 = vminps_avx(auVar130,auVar207);
                                        vpshufd_avx(ZEXT416((uint)lower_z.field_0.i[uVar42]),0);
                                        vpshufd_avx(ZEXT416((uint)upper_z.field_0.i[uVar42]),0);
                                        upper_x.field_0 = local_1b68;
                                        vcmpps_avx(ZEXT1632(auVar66),ZEXT1632(auVar66),0xf);
                                        auVar66 = *(undefined1 (*) [16])(ray + 0x80);
                                        auVar87 = vblendvps_avx(auVar66,local_1c28,
                                                                (undefined1  [16])aVar99);
                                        *(undefined1 (*) [16])(ray + 0x80) = auVar87;
                                        upper_y.field_0 = aVar99;
                                        lower_y.field_0._0_8_ = &upper_y;
                                        lower_y.field_0._8_8_ = pGVar15->userPtr;
                                        if (pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                          (*pGVar15->occlusionFilterN)
                                                    ((RTCFilterFunctionNArguments *)&lower_y);
                                          auVar284 = ZEXT1664(CONCAT412(0x7f800000,
                                                                        CONCAT48(0x7f800000,
                                                                                 0x7f8000007f800000)
                                                                       ));
                                        }
                                        if (upper_y.field_0 ==
                                            (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)0x0) {
                                          auVar87 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10
                                                                );
                                          auVar86 = vpcmpeqd_avx(auVar86,auVar86);
                                          auVar294 = ZEXT1664(auVar86);
                                          auVar86 = auVar86 ^ auVar87;
                                        }
                                        else {
                                          p_Var18 = context->args->filter;
                                          auVar86 = vpcmpeqd_avx(auVar86,auVar86);
                                          auVar294 = ZEXT1664(auVar86);
                                          if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                                             (((context->args->flags &
                                               RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                              (((pGVar15->field_8).field_0x2 & 0x40) != 0)))) {
                                            (*p_Var18)((RTCFilterFunctionNArguments *)&lower_y);
                                            auVar86 = vpcmpeqd_avx(auVar86,auVar86);
                                            auVar294 = ZEXT1664(auVar86);
                                            auVar284 = ZEXT1664(CONCAT412(0x7f800000,
                                                                          CONCAT48(0x7f800000,
                                                                                                                                                                      
                                                  0x7f8000007f800000)));
                                          }
                                          auVar87 = vpcmpeqd_avx((undefined1  [16])0x0,
                                                                 (undefined1  [16])upper_y.field_0);
                                          auVar86 = auVar294._0_16_ ^ auVar87;
                                          auVar156._8_4_ = 0xff800000;
                                          auVar156._0_8_ = 0xff800000ff800000;
                                          auVar156._12_4_ = 0xff800000;
                                          auVar87 = vblendvps_avx(auVar156,*(undefined1 (*) [16])
                                                                            (ray + 0x80),auVar87);
                                          *(undefined1 (*) [16])(ray + 0x80) = auVar87;
                                        }
                                        auVar86 = vpslld_avx(auVar86,0x1f);
                                        aVar99 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                                 vpsrad_avx(auVar86,0x1f);
                                        auVar66 = vblendvps_avx(auVar66,*(undefined1 (*) [16])pRVar2
                                                                ,auVar86);
                                        *(undefined1 (*) [16])pRVar2 = auVar66;
                                      }
                                      local_1c78 = vpandn_avx((undefined1  [16])aVar99,local_1c78);
                                    }
                                  }
                                }
                                if ((((local_1c78 >> 0x1f & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (local_1c78 >> 0x3f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (local_1c78 >> 0x5f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) && -1 < local_1c78[0xf]) break;
                                puVar52 = puVar52 + 8;
                                bVar56 = uVar42 < 3;
                                uVar42 = uVar42 + 1;
                              } while (bVar56);
                              auVar67 = auVar166 & local_1c78;
                              bVar56 = (((auVar67 >> 0x1f & (undefined1  [16])0x1) ==
                                         (undefined1  [16])0x0 &&
                                        (auVar67 >> 0x3f & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0) &&
                                       (auVar67 >> 0x5f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) && -1 < auVar67[0xf];
                              auVar67 = vandps_avx(local_1c78,auVar166);
                              auVar296 = ZEXT1664(auVar67);
                              auVar275 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                            CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa))
                                                 );
                              auVar289 = ZEXT1664(CONCAT412(0x3f800003,
                                                            CONCAT48(0x3f800003,0x3f8000033f800003))
                                                 );
                            }
                          } while ((!bVar56) && (uVar46 = uVar46 & uVar46 - 1, uVar46 != 0));
                        }
                        lVar38 = lVar38 + 1;
                      } while (lVar38 != uVar54 - 8);
                      aVar100._0_4_ = auVar296._0_4_ ^ auVar294._0_4_;
                      aVar100._4_4_ = auVar296._4_4_ ^ auVar294._4_4_;
                      aVar100._8_4_ = auVar296._8_4_ ^ auVar294._8_4_;
                      aVar100._12_4_ = auVar296._12_4_ ^ auVar294._12_4_;
                    }
                    terminated.field_0 =
                         (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                         vorps_avx((undefined1  [16])aVar100,(undefined1  [16])terminated.field_0);
                    auVar67 = auVar294._0_16_ & ~(undefined1  [16])terminated.field_0;
                    if ((((auVar67 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar67 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar67 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar67[0xf]) goto LAB_0033c096;
                    auVar157._8_4_ = 0xff800000;
                    auVar157._0_8_ = 0xff800000ff800000;
                    auVar157._12_4_ = 0xff800000;
                    tray.tfar.field_0 =
                         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar157,
                                       (undefined1  [16])terminated.field_0);
                    iVar36 = 0;
                    break;
                  }
                  goto LAB_0033c0a7;
                }
                auVar296 = ZEXT1664(auVar284._0_16_);
                uVar54 = 0;
                sVar44 = 8;
                do {
                  sVar14 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + uVar54 * 8);
                  if (sVar14 != 8) {
                    uVar39 = *(undefined4 *)(root.ptr + 0x20 + uVar54 * 4);
                    auVar59._4_4_ = uVar39;
                    auVar59._0_4_ = uVar39;
                    auVar59._8_4_ = uVar39;
                    auVar59._12_4_ = uVar39;
                    auVar25._8_8_ = tray.org.field_0._8_8_;
                    auVar25._0_8_ = tray.org.field_0._0_8_;
                    auVar26._8_8_ = tray.org.field_0._24_8_;
                    auVar26._0_8_ = tray.org.field_0._16_8_;
                    auVar27._8_8_ = tray.org.field_0._40_8_;
                    auVar27._0_8_ = tray.org.field_0._32_8_;
                    auVar67 = vsubps_avx(auVar59,auVar25);
                    auVar212._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar67._0_4_;
                    auVar212._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar67._4_4_;
                    auVar212._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar67._8_4_;
                    auVar212._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar67._12_4_;
                    uVar39 = *(undefined4 *)(root.ptr + 0x40 + uVar54 * 4);
                    auVar60._4_4_ = uVar39;
                    auVar60._0_4_ = uVar39;
                    auVar60._8_4_ = uVar39;
                    auVar60._12_4_ = uVar39;
                    auVar67 = vsubps_avx(auVar60,auVar26);
                    auVar241._0_4_ = tray.rdir.field_0._16_4_ * auVar67._0_4_;
                    auVar241._4_4_ = tray.rdir.field_0._20_4_ * auVar67._4_4_;
                    auVar241._8_4_ = tray.rdir.field_0._24_4_ * auVar67._8_4_;
                    auVar241._12_4_ = tray.rdir.field_0._28_4_ * auVar67._12_4_;
                    uVar39 = *(undefined4 *)(root.ptr + 0x60 + uVar54 * 4);
                    auVar61._4_4_ = uVar39;
                    auVar61._0_4_ = uVar39;
                    auVar61._8_4_ = uVar39;
                    auVar61._12_4_ = uVar39;
                    auVar67 = vsubps_avx(auVar61,auVar27);
                    auVar263._0_4_ = tray.rdir.field_0._32_4_ * auVar67._0_4_;
                    auVar263._4_4_ = tray.rdir.field_0._36_4_ * auVar67._4_4_;
                    auVar263._8_4_ = tray.rdir.field_0._40_4_ * auVar67._8_4_;
                    auVar263._12_4_ = tray.rdir.field_0._44_4_ * auVar67._12_4_;
                    uVar39 = *(undefined4 *)(root.ptr + 0x30 + uVar54 * 4);
                    auVar62._4_4_ = uVar39;
                    auVar62._0_4_ = uVar39;
                    auVar62._8_4_ = uVar39;
                    auVar62._12_4_ = uVar39;
                    auVar67 = vsubps_avx(auVar62,auVar25);
                    auVar109._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar67._0_4_;
                    auVar109._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar67._4_4_;
                    auVar109._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar67._8_4_;
                    auVar109._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar67._12_4_;
                    uVar39 = *(undefined4 *)(root.ptr + 0x50 + uVar54 * 4);
                    auVar63._4_4_ = uVar39;
                    auVar63._0_4_ = uVar39;
                    auVar63._8_4_ = uVar39;
                    auVar63._12_4_ = uVar39;
                    auVar67 = vsubps_avx(auVar63,auVar26);
                    auVar140._0_4_ = tray.rdir.field_0._16_4_ * auVar67._0_4_;
                    auVar140._4_4_ = tray.rdir.field_0._20_4_ * auVar67._4_4_;
                    auVar140._8_4_ = tray.rdir.field_0._24_4_ * auVar67._8_4_;
                    auVar140._12_4_ = tray.rdir.field_0._28_4_ * auVar67._12_4_;
                    uVar39 = *(undefined4 *)(root.ptr + 0x70 + uVar54 * 4);
                    auVar64._4_4_ = uVar39;
                    auVar64._0_4_ = uVar39;
                    auVar64._8_4_ = uVar39;
                    auVar64._12_4_ = uVar39;
                    auVar67 = vsubps_avx(auVar64,auVar27);
                    auVar167._0_4_ = tray.rdir.field_0._32_4_ * auVar67._0_4_;
                    auVar167._4_4_ = tray.rdir.field_0._36_4_ * auVar67._4_4_;
                    auVar167._8_4_ = tray.rdir.field_0._40_4_ * auVar67._8_4_;
                    auVar167._12_4_ = tray.rdir.field_0._44_4_ * auVar67._12_4_;
                    auVar67 = vminps_avx(auVar212,auVar109);
                    auVar166 = vminps_avx(auVar241,auVar140);
                    auVar67 = vmaxps_avx(auVar67,auVar166);
                    auVar166 = vminps_avx(auVar263,auVar167);
                    auVar67 = vmaxps_avx(auVar67,auVar166);
                    auVar65._0_4_ = auVar275._0_4_ * auVar67._0_4_;
                    auVar65._4_4_ = auVar275._4_4_ * auVar67._4_4_;
                    auVar65._8_4_ = auVar275._8_4_ * auVar67._8_4_;
                    auVar65._12_4_ = auVar275._12_4_ * auVar67._12_4_;
                    auVar67 = vmaxps_avx(auVar212,auVar109);
                    auVar166 = vmaxps_avx(auVar241,auVar140);
                    auVar166 = vminps_avx(auVar67,auVar166);
                    auVar67 = vmaxps_avx(auVar263,auVar167);
                    auVar67 = vminps_avx(auVar166,auVar67);
                    auVar110._0_4_ = auVar289._0_4_ * auVar67._0_4_;
                    auVar110._4_4_ = auVar289._4_4_ * auVar67._4_4_;
                    auVar110._8_4_ = auVar289._8_4_ * auVar67._8_4_;
                    auVar110._12_4_ = auVar289._12_4_ * auVar67._12_4_;
                    auVar67 = vmaxps_avx(auVar65,(undefined1  [16])tray.tnear.field_0);
                    auVar166 = vminps_avx(auVar110,(undefined1  [16])tray.tfar.field_0);
                    auVar67 = vcmpps_avx(auVar67,auVar166,2);
                    if ((((auVar67 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar67 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar67 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        auVar67[0xf] < '\0') {
                      auVar67 = vblendvps_avx(auVar284._0_16_,auVar65,auVar67);
                      if (sVar44 != 8) {
                        pNVar49->ptr = sVar44;
                        pNVar49 = pNVar49 + 1;
                        *paVar55 = auVar296._0_16_;
                        paVar55 = paVar55 + 1;
                      }
                      auVar296 = ZEXT1664(auVar67);
                      sVar44 = sVar14;
                    }
                  }
                } while ((sVar14 != 8) && (bVar56 = uVar54 < 3, uVar54 = uVar54 + 1, bVar56));
                iVar36 = 0;
                if (sVar44 == 8) {
LAB_0033a8d2:
                  bVar56 = false;
                  iVar36 = 4;
                }
                else {
                  auVar67 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                       (undefined1  [16])auVar296._0_16_,6);
                  uVar39 = vmovmskps_avx(auVar67);
                  bVar56 = true;
                  if ((uint)POPCOUNT(uVar39) <= uVar50) {
                    pNVar49->ptr = sVar44;
                    pNVar49 = pNVar49 + 1;
                    *paVar55 = auVar296._0_16_;
                    paVar55 = paVar55 + 1;
                    goto LAB_0033a8d2;
                  }
                }
                root.ptr = sVar44;
              } while (bVar56);
            }
          }
        }
      } while (iVar36 != 3);
      auVar21 = vandps_avx(auVar21,(undefined1  [16])terminated.field_0);
      auVar131._8_4_ = 0xff800000;
      auVar131._0_8_ = 0xff800000ff800000;
      auVar131._12_4_ = 0xff800000;
      auVar21 = vmaskmovps_avx(auVar21,auVar131);
      *(undefined1 (*) [16])pRVar2 = auVar21;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }